

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  void *pvVar9;
  __int_type_conflict _Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [60];
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  byte bVar52;
  uint uVar53;
  ulong uVar54;
  uint uVar56;
  uint uVar57;
  long lVar58;
  ulong uVar59;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  uint uVar60;
  ulong uVar61;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  undefined1 auVar79 [16];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  int iVar124;
  float t1;
  float fVar125;
  undefined1 auVar126 [16];
  float fVar128;
  float fVar129;
  undefined1 auVar127 [64];
  undefined4 uVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar148;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vfloat4 b0;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  vfloat4 b0_1;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar178 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  vfloat4 a0_2;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar218;
  float fVar229;
  float fVar230;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar231;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar232;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar239;
  float fVar248;
  float fVar249;
  vfloat4 a0_1;
  float fVar250;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar251;
  float fVar256;
  float fVar257;
  vfloat4 a0;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  float fVar258;
  undefined1 auVar255 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  int iVar275;
  undefined1 in_ZMM30 [64];
  undefined1 auVar276 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar277 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  uint auStack_5b0 [4];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  uint uStack_460;
  float afStack_45c [7];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar55;
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [64];
  
  PVar4 = prim[1];
  uVar59 = (ulong)(byte)PVar4;
  fVar149 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar62 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar62 = vinsertps_avx(auVar62,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar64 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar74 = vsubps_avx(auVar62,*(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  fVar148 = fVar149 * auVar74._0_4_;
  fVar125 = fVar149 * auVar64._0_4_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar59 * 4 + 6);
  auVar102 = vpmovsxbd_avx2(auVar62);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar59 * 5 + 6);
  auVar92 = vpmovsxbd_avx2(auVar73);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar59 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar72);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar59 * 0xb + 6);
  auVar105 = vpmovsxbd_avx2(auVar71);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar97 = vpmovsxbd_avx2(auVar70);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar106 = vcvtdq2ps_avx(auVar97);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar59 + 6);
  auVar93 = vpmovsxbd_avx2(auVar69);
  auVar93 = vcvtdq2ps_avx(auVar93);
  uVar61 = (ulong)(uint)((int)(uVar59 * 9) * 2);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar61 + 6);
  auVar94 = vpmovsxbd_avx2(auVar68);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar61 + uVar59 + 6);
  auVar95 = vpmovsxbd_avx2(auVar67);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar54 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar54 + 6);
  auVar91 = vpmovsxbd_avx2(auVar3);
  auVar96 = vcvtdq2ps_avx(auVar91);
  auVar164._4_4_ = fVar125;
  auVar164._0_4_ = fVar125;
  auVar164._8_4_ = fVar125;
  auVar164._12_4_ = fVar125;
  auVar164._16_4_ = fVar125;
  auVar164._20_4_ = fVar125;
  auVar164._24_4_ = fVar125;
  auVar164._28_4_ = fVar125;
  auVar267._8_4_ = 1;
  auVar267._0_8_ = 0x100000001;
  auVar267._12_4_ = 1;
  auVar267._16_4_ = 1;
  auVar267._20_4_ = 1;
  auVar267._24_4_ = 1;
  auVar267._28_4_ = 1;
  auVar269._32_32_ = in_ZmmResult._32_32_;
  auVar89 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar99 = ZEXT1632(CONCAT412(fVar149 * auVar64._12_4_,
                               CONCAT48(fVar149 * auVar64._8_4_,
                                        CONCAT44(fVar149 * auVar64._4_4_,fVar125))));
  auVar98 = vpermps_avx2(auVar267,auVar99);
  auVar90 = vpermps_avx512vl(auVar89,auVar99);
  fVar125 = auVar90._0_4_;
  fVar218 = auVar90._4_4_;
  auVar99._4_4_ = fVar218 * auVar104._4_4_;
  auVar99._0_4_ = fVar125 * auVar104._0_4_;
  fVar229 = auVar90._8_4_;
  auVar99._8_4_ = fVar229 * auVar104._8_4_;
  fVar230 = auVar90._12_4_;
  auVar99._12_4_ = fVar230 * auVar104._12_4_;
  fVar128 = auVar90._16_4_;
  auVar99._16_4_ = fVar128 * auVar104._16_4_;
  fVar129 = auVar90._20_4_;
  auVar99._20_4_ = fVar129 * auVar104._20_4_;
  fVar231 = auVar90._24_4_;
  auVar99._24_4_ = fVar231 * auVar104._24_4_;
  auVar99._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar93._4_4_ * fVar218;
  auVar97._0_4_ = auVar93._0_4_ * fVar125;
  auVar97._8_4_ = auVar93._8_4_ * fVar229;
  auVar97._12_4_ = auVar93._12_4_ * fVar230;
  auVar97._16_4_ = auVar93._16_4_ * fVar128;
  auVar97._20_4_ = auVar93._20_4_ * fVar129;
  auVar97._24_4_ = auVar93._24_4_ * fVar231;
  auVar97._28_4_ = auVar91._28_4_;
  auVar91._4_4_ = auVar96._4_4_ * fVar218;
  auVar91._0_4_ = auVar96._0_4_ * fVar125;
  auVar91._8_4_ = auVar96._8_4_ * fVar229;
  auVar91._12_4_ = auVar96._12_4_ * fVar230;
  auVar91._16_4_ = auVar96._16_4_ * fVar128;
  auVar91._20_4_ = auVar96._20_4_ * fVar129;
  auVar91._24_4_ = auVar96._24_4_ * fVar231;
  auVar91._28_4_ = auVar90._28_4_;
  auVar62 = vfmadd231ps_fma(auVar99,auVar98,auVar92);
  auVar73 = vfmadd231ps_fma(auVar97,auVar98,auVar106);
  auVar72 = vfmadd231ps_fma(auVar91,auVar95,auVar98);
  auVar62 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar164,auVar102);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar164,auVar105);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar94,auVar164);
  auVar254._4_4_ = fVar148;
  auVar254._0_4_ = fVar148;
  auVar254._8_4_ = fVar148;
  auVar254._12_4_ = fVar148;
  auVar254._16_4_ = fVar148;
  auVar254._20_4_ = fVar148;
  auVar254._24_4_ = fVar148;
  auVar254._28_4_ = fVar148;
  auVar91 = ZEXT1632(CONCAT412(fVar149 * auVar74._12_4_,
                               CONCAT48(fVar149 * auVar74._8_4_,
                                        CONCAT44(fVar149 * auVar74._4_4_,fVar148))));
  auVar97 = vpermps_avx2(auVar267,auVar91);
  auVar91 = vpermps_avx512vl(auVar89,auVar91);
  fVar149 = auVar91._0_4_;
  fVar125 = auVar91._4_4_;
  auVar98._4_4_ = fVar125 * auVar104._4_4_;
  auVar98._0_4_ = fVar149 * auVar104._0_4_;
  fVar218 = auVar91._8_4_;
  auVar98._8_4_ = fVar218 * auVar104._8_4_;
  fVar229 = auVar91._12_4_;
  auVar98._12_4_ = fVar229 * auVar104._12_4_;
  fVar230 = auVar91._16_4_;
  auVar98._16_4_ = fVar230 * auVar104._16_4_;
  fVar128 = auVar91._20_4_;
  auVar98._20_4_ = fVar128 * auVar104._20_4_;
  fVar129 = auVar91._24_4_;
  auVar98._24_4_ = fVar129 * auVar104._24_4_;
  auVar98._28_4_ = 1;
  auVar89._4_4_ = auVar93._4_4_ * fVar125;
  auVar89._0_4_ = auVar93._0_4_ * fVar149;
  auVar89._8_4_ = auVar93._8_4_ * fVar218;
  auVar89._12_4_ = auVar93._12_4_ * fVar229;
  auVar89._16_4_ = auVar93._16_4_ * fVar230;
  auVar89._20_4_ = auVar93._20_4_ * fVar128;
  auVar89._24_4_ = auVar93._24_4_ * fVar129;
  auVar89._28_4_ = auVar104._28_4_;
  auVar93._4_4_ = auVar96._4_4_ * fVar125;
  auVar93._0_4_ = auVar96._0_4_ * fVar149;
  auVar93._8_4_ = auVar96._8_4_ * fVar218;
  auVar93._12_4_ = auVar96._12_4_ * fVar229;
  auVar93._16_4_ = auVar96._16_4_ * fVar230;
  auVar93._20_4_ = auVar96._20_4_ * fVar128;
  auVar93._24_4_ = auVar96._24_4_ * fVar129;
  auVar93._28_4_ = auVar91._28_4_;
  auVar71 = vfmadd231ps_fma(auVar98,auVar97,auVar92);
  auVar70 = vfmadd231ps_fma(auVar89,auVar97,auVar106);
  auVar69 = vfmadd231ps_fma(auVar93,auVar97,auVar95);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar254,auVar102);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar254,auVar105);
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar254,auVar94);
  auVar102 = vandps_avx(ZEXT1632(auVar62),auVar108);
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar157._16_4_ = 0x219392ef;
  auVar157._20_4_ = 0x219392ef;
  auVar157._24_4_ = 0x219392ef;
  auVar157._28_4_ = 0x219392ef;
  uVar61 = vcmpps_avx512vl(auVar102,auVar157,1);
  bVar11 = (bool)((byte)uVar61 & 1);
  auVar90._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar62._0_4_;
  bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar62._4_4_;
  bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar62._8_4_;
  bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar62._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar61 >> 7) * 0x219392ef;
  auVar102 = vandps_avx(ZEXT1632(auVar73),auVar108);
  uVar61 = vcmpps_avx512vl(auVar102,auVar157,1);
  bVar11 = (bool)((byte)uVar61 & 1);
  auVar100._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar73._0_4_;
  bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar73._4_4_;
  bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar73._8_4_;
  bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar73._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar61 >> 7) * 0x219392ef;
  auVar102 = vandps_avx(ZEXT1632(auVar72),auVar108);
  uVar61 = vcmpps_avx512vl(auVar102,auVar157,1);
  bVar11 = (bool)((byte)uVar61 & 1);
  auVar102._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar72._0_4_;
  bVar11 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar72._4_4_;
  bVar11 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar72._8_4_;
  bVar11 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar72._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar61 >> 7) * 0x219392ef;
  auVar92 = vrcp14ps_avx512vl(auVar90);
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = &DAT_3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar109._16_4_ = 0x3f800000;
  auVar109._20_4_ = 0x3f800000;
  auVar109._24_4_ = 0x3f800000;
  auVar109._28_4_ = 0x3f800000;
  auVar62 = vfnmadd213ps_fma(auVar90,auVar92,auVar109);
  auVar62 = vfmadd132ps_fma(ZEXT1632(auVar62),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar100);
  auVar73 = vfnmadd213ps_fma(auVar100,auVar92,auVar109);
  auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar102);
  auVar72 = vfnmadd213ps_fma(auVar102,auVar92,auVar109);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar92,auVar92);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 7 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar71));
  auVar94._4_4_ = auVar62._4_4_ * auVar102._4_4_;
  auVar94._0_4_ = auVar62._0_4_ * auVar102._0_4_;
  auVar94._8_4_ = auVar62._8_4_ * auVar102._8_4_;
  auVar94._12_4_ = auVar62._12_4_ * auVar102._12_4_;
  auVar94._16_4_ = auVar102._16_4_ * 0.0;
  auVar94._20_4_ = auVar102._20_4_ * 0.0;
  auVar94._24_4_ = auVar102._24_4_ * 0.0;
  auVar94._28_4_ = auVar102._28_4_;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 9 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar71));
  auVar93 = vpbroadcastd_avx512vl();
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar107._0_4_ = auVar62._0_4_ * auVar102._0_4_;
  auVar107._4_4_ = auVar62._4_4_ * auVar102._4_4_;
  auVar107._8_4_ = auVar62._8_4_ * auVar102._8_4_;
  auVar107._12_4_ = auVar62._12_4_ * auVar102._12_4_;
  auVar107._16_4_ = auVar102._16_4_ * 0.0;
  auVar107._20_4_ = auVar102._20_4_ * 0.0;
  auVar107._24_4_ = auVar102._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar4 * 0x10 + uVar59 * -2 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar70));
  auVar95._4_4_ = auVar73._4_4_ * auVar102._4_4_;
  auVar95._0_4_ = auVar73._0_4_ * auVar102._0_4_;
  auVar95._8_4_ = auVar73._8_4_ * auVar102._8_4_;
  auVar95._12_4_ = auVar73._12_4_ * auVar102._12_4_;
  auVar95._16_4_ = auVar102._16_4_ * 0.0;
  auVar95._20_4_ = auVar102._20_4_ * 0.0;
  auVar95._24_4_ = auVar102._24_4_ * 0.0;
  auVar95._28_4_ = auVar102._28_4_;
  auVar102 = vcvtdq2ps_avx(auVar92);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar70));
  auVar103._0_4_ = auVar73._0_4_ * auVar102._0_4_;
  auVar103._4_4_ = auVar73._4_4_ * auVar102._4_4_;
  auVar103._8_4_ = auVar73._8_4_ * auVar102._8_4_;
  auVar103._12_4_ = auVar73._12_4_ * auVar102._12_4_;
  auVar103._16_4_ = auVar102._16_4_ * 0.0;
  auVar103._20_4_ = auVar102._20_4_ * 0.0;
  auVar103._24_4_ = auVar102._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar54 + uVar59 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar69));
  auVar96._4_4_ = auVar102._4_4_ * auVar72._4_4_;
  auVar96._0_4_ = auVar102._0_4_ * auVar72._0_4_;
  auVar96._8_4_ = auVar102._8_4_ * auVar72._8_4_;
  auVar96._12_4_ = auVar102._12_4_ * auVar72._12_4_;
  auVar96._16_4_ = auVar102._16_4_ * 0.0;
  auVar96._20_4_ = auVar102._20_4_ * 0.0;
  auVar96._24_4_ = auVar102._24_4_ * 0.0;
  auVar96._28_4_ = auVar102._28_4_;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar59 * 0x17 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar69));
  auVar101._0_4_ = auVar72._0_4_ * auVar102._0_4_;
  auVar101._4_4_ = auVar72._4_4_ * auVar102._4_4_;
  auVar101._8_4_ = auVar72._8_4_ * auVar102._8_4_;
  auVar101._12_4_ = auVar72._12_4_ * auVar102._12_4_;
  auVar101._16_4_ = auVar102._16_4_ * 0.0;
  auVar101._20_4_ = auVar102._20_4_ * 0.0;
  auVar101._24_4_ = auVar102._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar102 = vpminsd_avx2(auVar94,auVar107);
  auVar92 = vpminsd_avx2(auVar95,auVar103);
  auVar102 = vmaxps_avx(auVar102,auVar92);
  auVar92 = vpminsd_avx2(auVar96,auVar101);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar104._4_4_ = uVar130;
  auVar104._0_4_ = uVar130;
  auVar104._8_4_ = uVar130;
  auVar104._12_4_ = uVar130;
  auVar104._16_4_ = uVar130;
  auVar104._20_4_ = uVar130;
  auVar104._24_4_ = uVar130;
  auVar104._28_4_ = uVar130;
  auVar92 = vmaxps_avx512vl(auVar92,auVar104);
  auVar102 = vmaxps_avx(auVar102,auVar92);
  auVar92._8_4_ = 0x3f7ffffa;
  auVar92._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar92._12_4_ = 0x3f7ffffa;
  auVar92._16_4_ = 0x3f7ffffa;
  auVar92._20_4_ = 0x3f7ffffa;
  auVar92._24_4_ = 0x3f7ffffa;
  auVar92._28_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar102,auVar92);
  auVar102 = vpmaxsd_avx2(auVar94,auVar107);
  auVar92 = vpmaxsd_avx2(auVar95,auVar103);
  auVar102 = vminps_avx(auVar102,auVar92);
  auVar92 = vpmaxsd_avx2(auVar96,auVar101);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar105._4_4_ = uVar130;
  auVar105._0_4_ = uVar130;
  auVar105._8_4_ = uVar130;
  auVar105._12_4_ = uVar130;
  auVar105._16_4_ = uVar130;
  auVar105._20_4_ = uVar130;
  auVar105._24_4_ = uVar130;
  auVar105._28_4_ = uVar130;
  auVar92 = vminps_avx512vl(auVar92,auVar105);
  auVar102 = vminps_avx(auVar102,auVar92);
  auVar106._8_4_ = 0x3f800003;
  auVar106._0_8_ = 0x3f8000033f800003;
  auVar106._12_4_ = 0x3f800003;
  auVar106._16_4_ = 0x3f800003;
  auVar106._20_4_ = 0x3f800003;
  auVar106._24_4_ = 0x3f800003;
  auVar106._28_4_ = 0x3f800003;
  auVar269._0_32_ = vmulps_avx512vl(auVar102,auVar106);
  uVar28 = vpcmpgtd_avx512vl(auVar93,_DAT_0205a920);
  uVar27 = vcmpps_avx512vl(local_400,auVar269._0_32_,2);
  if ((byte)((byte)uVar27 & (byte)uVar28) == 0) {
    return;
  }
  uVar61 = (ulong)(byte)((byte)uVar27 & (byte)uVar28);
  auVar127 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar127);
  auVar127._16_48_ = auVar269._16_48_;
  auVar62 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar277 = ZEXT1664(auVar62);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar269 = ZEXT1664(auVar62);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar270 = ZEXT1664(auVar62);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar271 = ZEXT1664(auVar62);
  auVar62 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar276 = ZEXT1664(auVar62);
LAB_01d6a69f:
  lVar58 = 0;
  for (uVar54 = uVar61; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  uVar60 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar58 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar60].ptr;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar5);
  p_Var8 = pGVar7[1].intersectionFilterN;
  pvVar9 = pGVar7[2].userPtr;
  _Var10 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar62 = *(undefined1 (*) [16])(_Var10 + uVar54 * (long)pvVar9);
  auVar73 = *(undefined1 (*) [16])(_Var10 + (uVar54 + 1) * (long)pvVar9);
  auVar72 = *(undefined1 (*) [16])(_Var10 + (uVar54 + 2) * (long)pvVar9);
  auVar71 = *(undefined1 (*) [16])(_Var10 + (long)pvVar9 * (uVar54 + 3));
  lVar58 = *(long *)&pGVar7[1].time_range.upper;
  auVar70 = *(undefined1 (*) [16])(lVar58 + (long)p_Var8 * uVar54);
  auVar69 = *(undefined1 (*) [16])(lVar58 + (long)p_Var8 * (uVar54 + 1));
  auVar68 = *(undefined1 (*) [16])(lVar58 + (long)p_Var8 * (uVar54 + 2));
  uVar61 = uVar61 - 1 & uVar61;
  auVar67 = *(undefined1 (*) [16])(lVar58 + (long)p_Var8 * (uVar54 + 3));
  if (uVar61 != 0) {
    uVar59 = uVar61 - 1 & uVar61;
    for (uVar54 = uVar61; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    }
    if (uVar59 != 0) {
      for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c
                        );
  auVar3 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  fVar149 = *(float *)(ray + k * 4 + 0xc0);
  auVar131 = auVar277._0_16_;
  auVar63 = vmulps_avx512vl(auVar67,auVar131);
  auVar259._8_4_ = 0x3e2aaaab;
  auVar259._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar259._12_4_ = 0x3e2aaaab;
  auVar64 = vfmadd213ps_fma(auVar259,auVar68,auVar63);
  auVar265._8_4_ = 0x3f2aaaab;
  auVar265._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar265._12_4_ = 0x3f2aaaab;
  auVar64 = vfmadd231ps_fma(auVar64,auVar69,auVar265);
  auVar74 = vfmadd231ps_fma(auVar64,auVar70,auVar259);
  auVar75 = auVar269._0_16_;
  auVar64 = vfmadd231ps_avx512vl(auVar63,auVar68,auVar75);
  auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar69,auVar131);
  auVar65 = vfnmadd231ps_avx512vl(auVar64,auVar70,auVar75);
  auVar63 = vmulps_avx512vl(auVar71,auVar131);
  auVar64 = vfmadd213ps_fma(auVar259,auVar72,auVar63);
  auVar64 = vfmadd231ps_fma(auVar64,auVar73,auVar265);
  auVar64 = vfmadd231ps_fma(auVar64,auVar62,auVar259);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar72,auVar75);
  auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar73,auVar131);
  auVar66 = vfnmadd231ps_avx512vl(auVar63,auVar62,auVar75);
  auVar79._0_4_ = auVar67._0_4_ * 0.16666667;
  auVar79._4_4_ = auVar67._4_4_ * 0.16666667;
  auVar79._8_4_ = auVar67._8_4_ * 0.16666667;
  auVar79._12_4_ = auVar67._12_4_ * 0.16666667;
  auVar63 = vfmadd231ps_fma(auVar79,auVar68,auVar265);
  auVar63 = vfmadd231ps_fma(auVar63,auVar69,auVar259);
  auVar63 = vfmadd231ps_avx512vl(auVar63,auVar70,auVar131);
  auVar67 = vmulps_avx512vl(auVar67,auVar75);
  auVar68 = vfmadd231ps_avx512vl(auVar67,auVar131,auVar68);
  auVar69 = vfnmadd231ps_avx512vl(auVar68,auVar75,auVar69);
  auVar68 = vfnmadd231ps_avx512vl(auVar69,auVar131,auVar70);
  auVar211._0_4_ = auVar71._0_4_ * 0.16666667;
  auVar211._4_4_ = auVar71._4_4_ * 0.16666667;
  auVar211._8_4_ = auVar71._8_4_ * 0.16666667;
  auVar211._12_4_ = auVar71._12_4_ * 0.16666667;
  auVar70 = vfmadd231ps_fma(auVar211,auVar72,auVar265);
  auVar70 = vfmadd231ps_fma(auVar70,auVar73,auVar259);
  auVar70 = vfmadd231ps_avx512vl(auVar70,auVar62,auVar131);
  auVar71 = vmulps_avx512vl(auVar71,auVar75);
  auVar72 = vfmadd231ps_avx512vl(auVar71,auVar131,auVar72);
  auVar73 = vfnmadd231ps_avx512vl(auVar72,auVar75,auVar73);
  auVar69 = vfnmadd231ps_avx512vl(auVar73,auVar131,auVar62);
  auVar62 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar73 = vshufps_avx(auVar64,auVar64,0xc9);
  fVar128 = auVar65._0_4_;
  auVar84._0_4_ = fVar128 * auVar73._0_4_;
  fVar129 = auVar65._4_4_;
  auVar84._4_4_ = fVar129 * auVar73._4_4_;
  fVar231 = auVar65._8_4_;
  auVar84._8_4_ = fVar231 * auVar73._8_4_;
  fVar148 = auVar65._12_4_;
  auVar84._12_4_ = fVar148 * auVar73._12_4_;
  auVar73 = vfmsub231ps_fma(auVar84,auVar62,auVar64);
  auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar73 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar81._0_4_ = fVar128 * auVar73._0_4_;
  auVar81._4_4_ = fVar129 * auVar73._4_4_;
  auVar81._8_4_ = fVar231 * auVar73._8_4_;
  auVar81._12_4_ = fVar148 * auVar73._12_4_;
  auVar62 = vfmsub231ps_fma(auVar81,auVar62,auVar66);
  auVar71 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar62 = vshufps_avx(auVar68,auVar68,0xc9);
  auVar73 = vshufps_avx(auVar70,auVar70,0xc9);
  fVar232 = auVar68._0_4_;
  auVar85._0_4_ = fVar232 * auVar73._0_4_;
  fVar166 = auVar68._4_4_;
  auVar85._4_4_ = fVar166 * auVar73._4_4_;
  fVar167 = auVar68._8_4_;
  auVar85._8_4_ = fVar167 * auVar73._8_4_;
  fVar168 = auVar68._12_4_;
  auVar85._12_4_ = fVar168 * auVar73._12_4_;
  auVar73 = vfmsub231ps_fma(auVar85,auVar62,auVar70);
  auVar70 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar73 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar212._0_4_ = auVar73._0_4_ * fVar232;
  auVar212._4_4_ = auVar73._4_4_ * fVar166;
  auVar212._8_4_ = auVar73._8_4_ * fVar167;
  auVar212._12_4_ = auVar73._12_4_ * fVar168;
  auVar73 = vfmsub231ps_fma(auVar212,auVar62,auVar69);
  auVar62 = vdpps_avx(auVar72,auVar72,0x7f);
  auVar69 = vshufps_avx(auVar73,auVar73,0xc9);
  fVar218 = auVar62._0_4_;
  auVar268._16_48_ = auVar127._16_48_;
  auVar268._0_16_ = auVar131;
  auVar272._4_60_ = auVar268._4_60_;
  auVar272._0_4_ = fVar218;
  auVar73 = vrsqrt14ss_avx512f(auVar131,auVar272._0_16_);
  fVar125 = auVar73._0_4_;
  auVar67 = vmulss_avx512f(auVar62,ZEXT416(0xbf000000));
  auVar73 = vdpps_avx(auVar72,auVar71,0x7f);
  fVar125 = fVar125 * 1.5 + auVar67._0_4_ * fVar125 * fVar125 * fVar125;
  fVar239 = fVar125 * auVar72._0_4_;
  fVar248 = fVar125 * auVar72._4_4_;
  fVar249 = fVar125 * auVar72._8_4_;
  fVar250 = fVar125 * auVar72._12_4_;
  auVar219._0_4_ = auVar71._0_4_ * fVar218;
  auVar219._4_4_ = auVar71._4_4_ * fVar218;
  auVar219._8_4_ = auVar71._8_4_ * fVar218;
  auVar219._12_4_ = auVar71._12_4_ * fVar218;
  fVar218 = auVar73._0_4_;
  auVar87._0_4_ = fVar218 * auVar72._0_4_;
  auVar87._4_4_ = fVar218 * auVar72._4_4_;
  auVar87._8_4_ = fVar218 * auVar72._8_4_;
  auVar87._12_4_ = fVar218 * auVar72._12_4_;
  auVar72 = vsubps_avx(auVar219,auVar87);
  auVar73 = vrcp14ss_avx512f(auVar131,auVar272._0_16_);
  auVar62 = vfnmadd213ss_avx512f(auVar62,auVar73,ZEXT416(0x40000000));
  fVar229 = auVar73._0_4_ * auVar62._0_4_;
  auVar62 = vdpps_avx(auVar70,auVar70,0x7f);
  fVar230 = auVar62._0_4_;
  auVar273._16_48_ = auVar127._16_48_;
  auVar273._0_16_ = auVar131;
  auVar274._4_60_ = auVar273._4_60_;
  auVar274._0_4_ = fVar230;
  auVar73 = vrsqrt14ss_avx512f(auVar131,auVar274._0_16_);
  fVar218 = auVar73._0_4_;
  auVar73 = vmulss_avx512f(auVar62,ZEXT416(0xbf000000));
  fVar218 = fVar218 * 1.5 + auVar73._0_4_ * fVar218 * fVar218 * fVar218;
  auVar73 = vdpps_avx(auVar70,auVar69,0x7f);
  fVar251 = fVar218 * auVar70._0_4_;
  fVar256 = fVar218 * auVar70._4_4_;
  fVar257 = fVar218 * auVar70._8_4_;
  fVar258 = fVar218 * auVar70._12_4_;
  auVar82._0_4_ = fVar230 * auVar69._0_4_;
  auVar82._4_4_ = fVar230 * auVar69._4_4_;
  auVar82._8_4_ = fVar230 * auVar69._8_4_;
  auVar82._12_4_ = fVar230 * auVar69._12_4_;
  fVar230 = auVar73._0_4_;
  auVar86._0_4_ = fVar230 * auVar70._0_4_;
  auVar86._4_4_ = fVar230 * auVar70._4_4_;
  auVar86._8_4_ = fVar230 * auVar70._8_4_;
  auVar86._12_4_ = fVar230 * auVar70._12_4_;
  auVar71 = vsubps_avx(auVar82,auVar86);
  auVar73 = vrcp14ss_avx512f(auVar131,auVar274._0_16_);
  auVar62 = vfnmadd213ss_avx512f(auVar62,auVar73,ZEXT416(0x40000000));
  fVar230 = auVar62._0_4_ * auVar73._0_4_;
  auVar62 = vshufps_avx(auVar74,auVar74,0xff);
  auVar195._0_4_ = fVar239 * auVar62._0_4_;
  auVar195._4_4_ = fVar248 * auVar62._4_4_;
  auVar195._8_4_ = fVar249 * auVar62._8_4_;
  auVar195._12_4_ = fVar250 * auVar62._12_4_;
  local_4f0 = vsubps_avx(auVar74,auVar195);
  auVar73 = vshufps_avx(auVar65,auVar65,0xff);
  auVar83._0_4_ = auVar73._0_4_ * fVar239 + auVar62._0_4_ * fVar125 * fVar229 * auVar72._0_4_;
  auVar83._4_4_ = auVar73._4_4_ * fVar248 + auVar62._4_4_ * fVar125 * fVar229 * auVar72._4_4_;
  auVar83._8_4_ = auVar73._8_4_ * fVar249 + auVar62._8_4_ * fVar125 * fVar229 * auVar72._8_4_;
  auVar83._12_4_ = auVar73._12_4_ * fVar250 + auVar62._12_4_ * fVar125 * fVar229 * auVar72._12_4_;
  auVar72 = vsubps_avx(auVar65,auVar83);
  local_500._0_4_ = auVar195._0_4_ + auVar74._0_4_;
  local_500._4_4_ = auVar195._4_4_ + auVar74._4_4_;
  fStack_4f8 = auVar195._8_4_ + auVar74._8_4_;
  fStack_4f4 = auVar195._12_4_ + auVar74._12_4_;
  auVar62 = vshufps_avx(auVar63,auVar63,0xff);
  auVar175._0_4_ = fVar251 * auVar62._0_4_;
  auVar175._4_4_ = fVar256 * auVar62._4_4_;
  auVar175._8_4_ = fVar257 * auVar62._8_4_;
  auVar175._12_4_ = fVar258 * auVar62._12_4_;
  local_510 = vsubps_avx512vl(auVar63,auVar175);
  auVar73 = vshufps_avx(auVar68,auVar68,0xff);
  auVar65._0_4_ = auVar73._0_4_ * fVar251 + auVar62._0_4_ * fVar218 * auVar71._0_4_ * fVar230;
  auVar65._4_4_ = auVar73._4_4_ * fVar256 + auVar62._4_4_ * fVar218 * auVar71._4_4_ * fVar230;
  auVar65._8_4_ = auVar73._8_4_ * fVar257 + auVar62._8_4_ * fVar218 * auVar71._8_4_ * fVar230;
  auVar65._12_4_ = auVar73._12_4_ * fVar258 + auVar62._12_4_ * fVar218 * auVar71._12_4_ * fVar230;
  auVar62 = vsubps_avx(auVar68,auVar65);
  local_520._0_4_ = auVar63._0_4_ + auVar175._0_4_;
  local_520._4_4_ = auVar63._4_4_ + auVar175._4_4_;
  fStack_518 = auVar63._8_4_ + auVar175._8_4_;
  fStack_514 = auVar63._12_4_ + auVar175._12_4_;
  auVar80._0_4_ = auVar72._0_4_ * 0.33333334;
  auVar80._4_4_ = auVar72._4_4_ * 0.33333334;
  auVar80._8_4_ = auVar72._8_4_ * 0.33333334;
  auVar80._12_4_ = auVar72._12_4_ * 0.33333334;
  local_530 = vaddps_avx512vl(local_4f0,auVar80);
  auVar77._0_4_ = auVar62._0_4_ * 0.33333334;
  auVar77._4_4_ = auVar62._4_4_ * 0.33333334;
  auVar77._8_4_ = auVar62._8_4_ * 0.33333334;
  auVar77._12_4_ = auVar62._12_4_ * 0.33333334;
  local_540 = vsubps_avx512vl(local_510,auVar77);
  auVar64._0_4_ = (fVar128 + auVar83._0_4_) * 0.33333334;
  auVar64._4_4_ = (fVar129 + auVar83._4_4_) * 0.33333334;
  auVar64._8_4_ = (fVar231 + auVar83._8_4_) * 0.33333334;
  auVar64._12_4_ = (fVar148 + auVar83._12_4_) * 0.33333334;
  _local_550 = vaddps_avx512vl(_local_500,auVar64);
  auVar74._0_4_ = (fVar232 + auVar65._0_4_) * 0.33333334;
  auVar74._4_4_ = (fVar166 + auVar65._4_4_) * 0.33333334;
  auVar74._8_4_ = (fVar167 + auVar65._8_4_) * 0.33333334;
  auVar74._12_4_ = (fVar168 + auVar65._12_4_) * 0.33333334;
  _local_560 = vsubps_avx512vl(_local_520,auVar74);
  local_470 = vsubps_avx(local_4f0,auVar3);
  uVar130 = local_470._0_4_;
  auVar66._4_4_ = uVar130;
  auVar66._0_4_ = uVar130;
  auVar66._8_4_ = uVar130;
  auVar66._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_470,local_470,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar73 = vshufps_avx(local_470,local_470,0xaa);
  fVar125 = pre->ray_space[k].vz.field_0.m128[0];
  fVar218 = pre->ray_space[k].vz.field_0.m128[1];
  fVar229 = pre->ray_space[k].vz.field_0.m128[2];
  fVar230 = pre->ray_space[k].vz.field_0.m128[3];
  auVar63._0_4_ = fVar125 * auVar73._0_4_;
  auVar63._4_4_ = fVar218 * auVar73._4_4_;
  auVar63._8_4_ = fVar229 * auVar73._8_4_;
  auVar63._12_4_ = fVar230 * auVar73._12_4_;
  auVar62 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar62);
  auVar68 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar66);
  local_480 = vsubps_avx512vl(local_530,auVar3);
  uVar130 = local_480._0_4_;
  auVar88._4_4_ = uVar130;
  auVar88._0_4_ = uVar130;
  auVar88._8_4_ = uVar130;
  auVar88._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_480,local_480,0x55);
  auVar73 = vshufps_avx(local_480,local_480,0xaa);
  auVar76._0_4_ = fVar125 * auVar73._0_4_;
  auVar76._4_4_ = fVar218 * auVar73._4_4_;
  auVar76._8_4_ = fVar229 * auVar73._8_4_;
  auVar76._12_4_ = fVar230 * auVar73._12_4_;
  auVar62 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar2,auVar62);
  auVar67 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar88);
  local_490 = vsubps_avx512vl(local_540,auVar3);
  uVar130 = local_490._0_4_;
  auVar176._4_4_ = uVar130;
  auVar176._0_4_ = uVar130;
  auVar176._8_4_ = uVar130;
  auVar176._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_490,local_490,0x55);
  auVar73 = vshufps_avx(local_490,local_490,0xaa);
  auVar78._0_4_ = fVar125 * auVar73._0_4_;
  auVar78._4_4_ = fVar218 * auVar73._4_4_;
  auVar78._8_4_ = fVar229 * auVar73._8_4_;
  auVar78._12_4_ = fVar230 * auVar73._12_4_;
  auVar62 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar2,auVar62);
  auVar64 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar176);
  local_4a0 = vsubps_avx512vl(local_510,auVar3);
  uVar130 = local_4a0._0_4_;
  auVar196._4_4_ = uVar130;
  auVar196._0_4_ = uVar130;
  auVar196._8_4_ = uVar130;
  auVar196._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar73 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar177._0_4_ = fVar125 * auVar73._0_4_;
  auVar177._4_4_ = fVar218 * auVar73._4_4_;
  auVar177._8_4_ = fVar229 * auVar73._8_4_;
  auVar177._12_4_ = fVar230 * auVar73._12_4_;
  auVar62 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar2,auVar62);
  auVar74 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar196);
  local_4b0 = vsubps_avx(_local_500,auVar3);
  uVar130 = local_4b0._0_4_;
  auVar197._4_4_ = uVar130;
  auVar197._0_4_ = uVar130;
  auVar197._8_4_ = uVar130;
  auVar197._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar73 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar220._0_4_ = auVar73._0_4_ * fVar125;
  auVar220._4_4_ = auVar73._4_4_ * fVar218;
  auVar220._8_4_ = auVar73._8_4_ * fVar229;
  auVar220._12_4_ = auVar73._12_4_ * fVar230;
  auVar62 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar2,auVar62);
  auVar63 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar197);
  local_4c0 = vsubps_avx512vl(_local_550,auVar3);
  uVar130 = local_4c0._0_4_;
  auVar198._4_4_ = uVar130;
  auVar198._0_4_ = uVar130;
  auVar198._8_4_ = uVar130;
  auVar198._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar73 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar233._0_4_ = auVar73._0_4_ * fVar125;
  auVar233._4_4_ = auVar73._4_4_ * fVar218;
  auVar233._8_4_ = auVar73._8_4_ * fVar229;
  auVar233._12_4_ = auVar73._12_4_ * fVar230;
  auVar62 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar2,auVar62);
  auVar65 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar198);
  local_4d0 = vsubps_avx512vl(_local_560,auVar3);
  uVar130 = local_4d0._0_4_;
  auVar199._4_4_ = uVar130;
  auVar199._0_4_ = uVar130;
  auVar199._8_4_ = uVar130;
  auVar199._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar73 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar240._0_4_ = auVar73._0_4_ * fVar125;
  auVar240._4_4_ = auVar73._4_4_ * fVar218;
  auVar240._8_4_ = auVar73._8_4_ * fVar229;
  auVar240._12_4_ = auVar73._12_4_ * fVar230;
  auVar62 = vfmadd231ps_fma(auVar240,(undefined1  [16])aVar2,auVar62);
  auVar66 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar199);
  local_4e0 = vsubps_avx(_local_520,auVar3);
  uVar130 = local_4e0._0_4_;
  auVar75._4_4_ = uVar130;
  auVar75._0_4_ = uVar130;
  auVar75._8_4_ = uVar130;
  auVar75._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar73 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar184._0_4_ = auVar73._0_4_ * fVar125;
  auVar184._4_4_ = auVar73._4_4_ * fVar218;
  auVar184._8_4_ = auVar73._8_4_ * fVar229;
  auVar184._12_4_ = auVar73._12_4_ * fVar230;
  auVar62 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar2,auVar62);
  auVar3 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar75);
  auVar72 = vmovlhps_avx(auVar68,auVar63);
  auVar71 = vmovlhps_avx(auVar67,auVar65);
  auVar69 = vmovlhps_avx512f(auVar64,auVar66);
  _local_5e0 = vmovlhps_avx512f(auVar74,auVar3);
  auVar73 = vminps_avx(auVar72,auVar71);
  auVar62 = vmaxps_avx(auVar72,auVar71);
  auVar70 = vminps_avx512vl(auVar69,_local_5e0);
  auVar73 = vminps_avx(auVar73,auVar70);
  auVar70 = vmaxps_avx512vl(auVar69,_local_5e0);
  auVar62 = vmaxps_avx(auVar62,auVar70);
  auVar70 = vshufpd_avx(auVar73,auVar73,3);
  auVar73 = vminps_avx(auVar73,auVar70);
  auVar70 = vshufpd_avx(auVar62,auVar62,3);
  auVar62 = vmaxps_avx(auVar62,auVar70);
  auVar73 = vandps_avx512vl(auVar73,auVar270._0_16_);
  auVar62 = vandps_avx512vl(auVar62,auVar270._0_16_);
  auVar62 = vmaxps_avx(auVar73,auVar62);
  auVar73 = vmovshdup_avx(auVar62);
  auVar62 = vmaxss_avx(auVar73,auVar62);
  local_5c0 = vmovddup_avx512vl(auVar68);
  local_5d0 = vmovddup_avx512vl(auVar67);
  auVar131._8_8_ = auVar64._0_8_;
  auVar131._0_8_ = auVar64._0_8_;
  auVar178._0_8_ = auVar74._0_8_;
  auVar178._8_8_ = auVar178._0_8_;
  local_5f0 = ZEXT416((uint)(auVar62._0_4_ * 9.536743e-07));
  local_3c0 = vbroadcastss_avx512vl(local_5f0);
  auVar62 = vxorps_avx512vl(local_3c0._0_16_,auVar271._0_16_);
  local_3e0 = vbroadcastss_avx512vl(auVar62);
  uVar54 = 0;
  auVar62 = vsubps_avx(auVar71,auVar72);
  auVar70 = vsubps_avx512vl(auVar69,auVar71);
  auVar68 = vsubps_avx512vl(_local_5e0,auVar69);
  local_570 = vsubps_avx(_local_500,local_4f0);
  local_580 = vsubps_avx512vl(_local_550,local_530);
  local_590 = vsubps_avx512vl(_local_560,local_540);
  _local_5a0 = vsubps_avx512vl(_local_520,local_510);
  auVar269 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar269);
  auVar269 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar269);
  auVar73 = ZEXT816(0x3f80000000000000);
  auVar268 = ZEXT1664(auVar73);
  auVar122._32_32_ = auVar269._32_32_;
  do {
    auVar77 = auVar268._0_16_;
    auVar67 = vshufps_avx(auVar77,auVar77,0x50);
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar64 = vsubps_avx512vl(auVar94._0_16_,auVar67);
    fVar125 = auVar67._0_4_;
    fVar128 = auVar63._0_4_;
    auVar150._0_4_ = fVar128 * fVar125;
    fVar218 = auVar67._4_4_;
    fVar129 = auVar63._4_4_;
    auVar150._4_4_ = fVar129 * fVar218;
    fVar229 = auVar67._8_4_;
    auVar150._8_4_ = fVar128 * fVar229;
    fVar230 = auVar67._12_4_;
    auVar150._12_4_ = fVar129 * fVar230;
    fVar166 = auVar65._0_4_;
    auVar160._0_4_ = fVar166 * fVar125;
    fVar167 = auVar65._4_4_;
    auVar160._4_4_ = fVar167 * fVar218;
    auVar160._8_4_ = fVar166 * fVar229;
    auVar160._12_4_ = fVar167 * fVar230;
    fVar168 = auVar66._0_4_;
    auVar169._0_4_ = fVar168 * fVar125;
    fVar239 = auVar66._4_4_;
    auVar169._4_4_ = fVar239 * fVar218;
    auVar169._8_4_ = fVar168 * fVar229;
    auVar169._12_4_ = fVar239 * fVar230;
    fVar248 = auVar3._0_4_;
    auVar132._0_4_ = fVar248 * fVar125;
    fVar249 = auVar3._4_4_;
    auVar132._4_4_ = fVar249 * fVar218;
    auVar132._8_4_ = fVar248 * fVar229;
    auVar132._12_4_ = fVar249 * fVar230;
    auVar74 = vfmadd231ps_avx512vl(auVar150,auVar64,local_5c0);
    auVar75 = vfmadd231ps_avx512vl(auVar160,auVar64,local_5d0);
    auVar76 = vfmadd231ps_avx512vl(auVar169,auVar64,auVar131);
    auVar64 = vfmadd231ps_fma(auVar132,auVar178,auVar64);
    auVar67 = vmovshdup_avx(auVar73);
    fVar218 = auVar73._0_4_;
    fVar125 = (auVar67._0_4_ - fVar218) * 0.04761905;
    auVar194._4_4_ = fVar218;
    auVar194._0_4_ = fVar218;
    auVar194._8_4_ = fVar218;
    auVar194._12_4_ = fVar218;
    auVar194._16_4_ = fVar218;
    auVar194._20_4_ = fVar218;
    auVar194._24_4_ = fVar218;
    auVar194._28_4_ = fVar218;
    auVar145._0_8_ = auVar67._0_8_;
    auVar145._8_8_ = auVar145._0_8_;
    auVar145._16_8_ = auVar145._0_8_;
    auVar145._24_8_ = auVar145._0_8_;
    auVar102 = vsubps_avx(auVar145,auVar194);
    uVar130 = auVar74._0_4_;
    auVar146._4_4_ = uVar130;
    auVar146._0_4_ = uVar130;
    auVar146._8_4_ = uVar130;
    auVar146._12_4_ = uVar130;
    auVar146._16_4_ = uVar130;
    auVar146._20_4_ = uVar130;
    auVar146._24_4_ = uVar130;
    auVar146._28_4_ = uVar130;
    auVar215._8_4_ = 1;
    auVar215._0_8_ = 0x100000001;
    auVar215._12_4_ = 1;
    auVar215._16_4_ = 1;
    auVar215._20_4_ = 1;
    auVar215._24_4_ = 1;
    auVar215._28_4_ = 1;
    auVar104 = ZEXT1632(auVar74);
    auVar92 = vpermps_avx2(auVar215,auVar104);
    auVar95 = vbroadcastss_avx512vl(auVar75);
    auVar105 = ZEXT1632(auVar75);
    auVar96 = vpermps_avx512vl(auVar215,auVar105);
    auVar97 = vbroadcastss_avx512vl(auVar76);
    auVar93 = ZEXT1632(auVar76);
    auVar91 = vpermps_avx512vl(auVar215,auVar93);
    auVar98 = vbroadcastss_avx512vl(auVar64);
    auVar101 = ZEXT1632(auVar64);
    auVar99 = vpermps_avx512vl(auVar215,auVar101);
    auVar216._4_4_ = fVar125;
    auVar216._0_4_ = fVar125;
    auVar216._8_4_ = fVar125;
    auVar216._12_4_ = fVar125;
    auVar216._16_4_ = fVar125;
    auVar216._20_4_ = fVar125;
    auVar216._24_4_ = fVar125;
    auVar216._28_4_ = fVar125;
    auVar255._8_4_ = 2;
    auVar255._0_8_ = 0x200000002;
    auVar255._12_4_ = 2;
    auVar255._16_4_ = 2;
    auVar255._20_4_ = 2;
    auVar255._24_4_ = 2;
    auVar255._28_4_ = 2;
    auVar89 = vpermps_avx512vl(auVar255,auVar104);
    auVar182._8_4_ = 3;
    auVar182._0_8_ = 0x300000003;
    auVar182._12_4_ = 3;
    auVar182._16_4_ = 3;
    auVar182._20_4_ = 3;
    auVar182._24_4_ = 3;
    auVar182._28_4_ = 3;
    auVar90 = vpermps_avx512vl(auVar182,auVar104);
    auVar104 = vpermps_avx2(auVar255,auVar105);
    auVar105 = vpermps_avx2(auVar182,auVar105);
    auVar106 = vpermps_avx2(auVar255,auVar93);
    auVar93 = vpermps_avx2(auVar182,auVar93);
    auVar100 = vpermps_avx512vl(auVar255,auVar101);
    auVar101 = vpermps_avx512vl(auVar182,auVar101);
    auVar67 = vfmadd132ps_fma(auVar102,auVar194,_DAT_02020f20);
    auVar94 = vsubps_avx512vl(auVar94,ZEXT1632(auVar67));
    auVar102 = vmulps_avx512vl(auVar95,ZEXT1632(auVar67));
    auVar107 = ZEXT1632(auVar67);
    auVar103 = vmulps_avx512vl(auVar96,auVar107);
    auVar64 = vfmadd231ps_fma(auVar102,auVar94,auVar146);
    auVar74 = vfmadd231ps_fma(auVar103,auVar94,auVar92);
    auVar102 = vmulps_avx512vl(auVar97,auVar107);
    auVar103 = vmulps_avx512vl(auVar91,auVar107);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,auVar95);
    auVar95 = vfmadd231ps_avx512vl(auVar103,auVar94,auVar96);
    auVar96 = vmulps_avx512vl(auVar98,auVar107);
    auVar103 = ZEXT1632(auVar67);
    auVar99 = vmulps_avx512vl(auVar99,auVar103);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar97);
    auVar97 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar91);
    fVar229 = auVar67._0_4_;
    fVar230 = auVar67._4_4_;
    auVar31._4_4_ = fVar230 * auVar102._4_4_;
    auVar31._0_4_ = fVar229 * auVar102._0_4_;
    fVar231 = auVar67._8_4_;
    auVar31._8_4_ = fVar231 * auVar102._8_4_;
    fVar148 = auVar67._12_4_;
    auVar31._12_4_ = fVar148 * auVar102._12_4_;
    auVar31._16_4_ = auVar102._16_4_ * 0.0;
    auVar31._20_4_ = auVar102._20_4_ * 0.0;
    auVar31._24_4_ = auVar102._24_4_ * 0.0;
    auVar31._28_4_ = fVar218;
    auVar32._4_4_ = fVar230 * auVar95._4_4_;
    auVar32._0_4_ = fVar229 * auVar95._0_4_;
    auVar32._8_4_ = fVar231 * auVar95._8_4_;
    auVar32._12_4_ = fVar148 * auVar95._12_4_;
    auVar32._16_4_ = auVar95._16_4_ * 0.0;
    auVar32._20_4_ = auVar95._20_4_ * 0.0;
    auVar32._24_4_ = auVar95._24_4_ * 0.0;
    auVar32._28_4_ = auVar92._28_4_;
    auVar64 = vfmadd231ps_fma(auVar31,auVar94,ZEXT1632(auVar64));
    auVar74 = vfmadd231ps_fma(auVar32,auVar94,ZEXT1632(auVar74));
    auVar138._0_4_ = fVar229 * auVar96._0_4_;
    auVar138._4_4_ = fVar230 * auVar96._4_4_;
    auVar138._8_4_ = fVar231 * auVar96._8_4_;
    auVar138._12_4_ = fVar148 * auVar96._12_4_;
    auVar138._16_4_ = auVar96._16_4_ * 0.0;
    auVar138._20_4_ = auVar96._20_4_ * 0.0;
    auVar138._24_4_ = auVar96._24_4_ * 0.0;
    auVar138._28_4_ = 0;
    auVar33._4_4_ = fVar230 * auVar97._4_4_;
    auVar33._0_4_ = fVar229 * auVar97._0_4_;
    auVar33._8_4_ = fVar231 * auVar97._8_4_;
    auVar33._12_4_ = fVar148 * auVar97._12_4_;
    auVar33._16_4_ = auVar97._16_4_ * 0.0;
    auVar33._20_4_ = auVar97._20_4_ * 0.0;
    auVar33._24_4_ = auVar97._24_4_ * 0.0;
    auVar33._28_4_ = auVar96._28_4_;
    auVar75 = vfmadd231ps_fma(auVar138,auVar94,auVar102);
    auVar76 = vfmadd231ps_fma(auVar33,auVar94,auVar95);
    auVar34._28_4_ = auVar95._28_4_;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(fVar148 * auVar76._12_4_,
                            CONCAT48(fVar231 * auVar76._8_4_,
                                     CONCAT44(fVar230 * auVar76._4_4_,fVar229 * auVar76._0_4_))));
    auVar79 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar148 * auVar75._12_4_,
                                                 CONCAT48(fVar231 * auVar75._8_4_,
                                                          CONCAT44(fVar230 * auVar75._4_4_,
                                                                   fVar229 * auVar75._0_4_)))),
                              auVar94,ZEXT1632(auVar64));
    auVar80 = vfmadd231ps_fma(auVar34,auVar94,ZEXT1632(auVar74));
    auVar102 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar64));
    auVar92 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar74));
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar102 = vmulps_avx512vl(auVar102,auVar95);
    auVar92 = vmulps_avx512vl(auVar92,auVar95);
    auVar210._0_4_ = fVar125 * auVar102._0_4_;
    auVar210._4_4_ = fVar125 * auVar102._4_4_;
    auVar210._8_4_ = fVar125 * auVar102._8_4_;
    auVar210._12_4_ = fVar125 * auVar102._12_4_;
    auVar210._16_4_ = fVar125 * auVar102._16_4_;
    auVar210._20_4_ = fVar125 * auVar102._20_4_;
    auVar210._24_4_ = fVar125 * auVar102._24_4_;
    auVar210._28_4_ = 0;
    auVar102 = vmulps_avx512vl(auVar216,auVar92);
    auVar75 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
    auVar96 = vpermt2ps_avx512vl(ZEXT1632(auVar79),_DAT_0205fd20,ZEXT1632(auVar75));
    auVar97 = vpermt2ps_avx512vl(ZEXT1632(auVar80),_DAT_0205fd20,ZEXT1632(auVar75));
    auVar139._0_4_ = auVar210._0_4_ + auVar79._0_4_;
    auVar139._4_4_ = auVar210._4_4_ + auVar79._4_4_;
    auVar139._8_4_ = auVar210._8_4_ + auVar79._8_4_;
    auVar139._12_4_ = auVar210._12_4_ + auVar79._12_4_;
    auVar139._16_4_ = auVar210._16_4_ + 0.0;
    auVar139._20_4_ = auVar210._20_4_ + 0.0;
    auVar139._24_4_ = auVar210._24_4_ + 0.0;
    auVar139._28_4_ = 0;
    auVar107 = ZEXT1632(auVar75);
    auVar92 = vpermt2ps_avx512vl(auVar210,_DAT_0205fd20,auVar107);
    auVar91 = vaddps_avx512vl(ZEXT1632(auVar80),auVar102);
    auVar98 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,auVar107);
    auVar102 = vsubps_avx(auVar96,auVar92);
    auVar98 = vsubps_avx512vl(auVar97,auVar98);
    auVar92 = vmulps_avx512vl(auVar104,auVar103);
    auVar99 = vmulps_avx512vl(auVar105,auVar103);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar94,auVar89);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar90);
    auVar89 = vmulps_avx512vl(auVar106,auVar103);
    auVar90 = vmulps_avx512vl(auVar93,auVar103);
    auVar104 = vfmadd231ps_avx512vl(auVar89,auVar94,auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar90,auVar94,auVar105);
    auVar89 = vmulps_avx512vl(auVar100,auVar103);
    auVar90 = vmulps_avx512vl(auVar101,auVar103);
    auVar64 = vfmadd231ps_fma(auVar89,auVar94,auVar106);
    auVar74 = vfmadd231ps_fma(auVar90,auVar94,auVar93);
    auVar89 = vmulps_avx512vl(auVar103,auVar104);
    auVar90 = vmulps_avx512vl(ZEXT1632(auVar67),auVar105);
    auVar92 = vfmadd231ps_avx512vl(auVar89,auVar94,auVar92);
    auVar99 = vfmadd231ps_avx512vl(auVar90,auVar94,auVar99);
    auVar104 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar148 * auVar64._12_4_,
                                             CONCAT48(fVar231 * auVar64._8_4_,
                                                      CONCAT44(fVar230 * auVar64._4_4_,
                                                               fVar229 * auVar64._0_4_)))),auVar94,
                          auVar104);
    auVar105 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar148 * auVar74._12_4_,
                                             CONCAT48(fVar231 * auVar74._8_4_,
                                                      CONCAT44(fVar230 * auVar74._4_4_,
                                                               fVar229 * auVar74._0_4_)))),auVar94,
                          auVar105);
    auVar35._4_4_ = fVar230 * auVar104._4_4_;
    auVar35._0_4_ = fVar229 * auVar104._0_4_;
    auVar35._8_4_ = fVar231 * auVar104._8_4_;
    auVar35._12_4_ = fVar148 * auVar104._12_4_;
    auVar35._16_4_ = auVar104._16_4_ * 0.0;
    auVar35._20_4_ = auVar104._20_4_ * 0.0;
    auVar35._24_4_ = auVar104._24_4_ * 0.0;
    auVar35._28_4_ = auVar93._28_4_;
    auVar36._4_4_ = fVar230 * auVar105._4_4_;
    auVar36._0_4_ = fVar229 * auVar105._0_4_;
    auVar36._8_4_ = fVar231 * auVar105._8_4_;
    auVar36._12_4_ = fVar148 * auVar105._12_4_;
    auVar36._16_4_ = auVar105._16_4_ * 0.0;
    auVar36._20_4_ = auVar105._20_4_ * 0.0;
    auVar36._24_4_ = auVar105._24_4_ * 0.0;
    auVar36._28_4_ = auVar106._28_4_;
    auVar106 = vfmadd231ps_avx512vl(auVar35,auVar94,auVar92);
    auVar93 = vfmadd231ps_avx512vl(auVar36,auVar99,auVar94);
    auVar92 = vsubps_avx512vl(auVar104,auVar92);
    auVar104 = vsubps_avx512vl(auVar105,auVar99);
    auVar92 = vmulps_avx512vl(auVar92,auVar95);
    auVar104 = vmulps_avx512vl(auVar104,auVar95);
    fVar218 = fVar125 * auVar92._0_4_;
    fVar229 = fVar125 * auVar92._4_4_;
    auVar37._4_4_ = fVar229;
    auVar37._0_4_ = fVar218;
    fVar230 = fVar125 * auVar92._8_4_;
    auVar37._8_4_ = fVar230;
    fVar231 = fVar125 * auVar92._12_4_;
    auVar37._12_4_ = fVar231;
    fVar148 = fVar125 * auVar92._16_4_;
    auVar37._16_4_ = fVar148;
    fVar232 = fVar125 * auVar92._20_4_;
    auVar37._20_4_ = fVar232;
    fVar125 = fVar125 * auVar92._24_4_;
    auVar37._24_4_ = fVar125;
    auVar37._28_4_ = auVar92._28_4_;
    auVar104 = vmulps_avx512vl(auVar216,auVar104);
    auVar105 = vpermt2ps_avx512vl(auVar106,_DAT_0205fd20,auVar107);
    auVar94 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,auVar107);
    auVar217._0_4_ = auVar106._0_4_ + fVar218;
    auVar217._4_4_ = auVar106._4_4_ + fVar229;
    auVar217._8_4_ = auVar106._8_4_ + fVar230;
    auVar217._12_4_ = auVar106._12_4_ + fVar231;
    auVar217._16_4_ = auVar106._16_4_ + fVar148;
    auVar217._20_4_ = auVar106._20_4_ + fVar232;
    auVar217._24_4_ = auVar106._24_4_ + fVar125;
    auVar217._28_4_ = auVar106._28_4_ + auVar92._28_4_;
    auVar92 = vpermt2ps_avx512vl(auVar37,_DAT_0205fd20,ZEXT1632(auVar75));
    auVar95 = vaddps_avx512vl(auVar93,auVar104);
    auVar104 = vpermt2ps_avx512vl(auVar104,_DAT_0205fd20,ZEXT1632(auVar75));
    auVar92 = vsubps_avx(auVar105,auVar92);
    auVar104 = vsubps_avx512vl(auVar94,auVar104);
    auVar157 = ZEXT1632(auVar79);
    auVar99 = vsubps_avx512vl(auVar106,auVar157);
    auVar164 = ZEXT1632(auVar80);
    auVar89 = vsubps_avx512vl(auVar93,auVar164);
    auVar90 = vsubps_avx512vl(auVar105,auVar96);
    auVar99 = vaddps_avx512vl(auVar99,auVar90);
    auVar90 = vsubps_avx512vl(auVar94,auVar97);
    auVar89 = vaddps_avx512vl(auVar89,auVar90);
    auVar90 = vmulps_avx512vl(auVar164,auVar99);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar157,auVar89);
    auVar100 = vmulps_avx512vl(auVar91,auVar99);
    auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar139,auVar89);
    auVar101 = vmulps_avx512vl(auVar98,auVar99);
    auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar102,auVar89);
    auVar103 = vmulps_avx512vl(auVar97,auVar99);
    auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar96,auVar89);
    auVar107 = vmulps_avx512vl(auVar93,auVar99);
    auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar106,auVar89);
    auVar108 = vmulps_avx512vl(auVar95,auVar99);
    auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar217,auVar89);
    auVar109 = vmulps_avx512vl(auVar104,auVar99);
    auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar92,auVar89);
    auVar99 = vmulps_avx512vl(auVar94,auVar99);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar105,auVar89);
    auVar89 = vminps_avx512vl(auVar90,auVar100);
    auVar90 = vmaxps_avx512vl(auVar90,auVar100);
    auVar100 = vminps_avx512vl(auVar101,auVar103);
    auVar89 = vminps_avx512vl(auVar89,auVar100);
    auVar100 = vmaxps_avx512vl(auVar101,auVar103);
    auVar90 = vmaxps_avx512vl(auVar90,auVar100);
    auVar100 = vminps_avx512vl(auVar107,auVar108);
    auVar101 = vmaxps_avx512vl(auVar107,auVar108);
    auVar103 = vminps_avx512vl(auVar109,auVar99);
    auVar100 = vminps_avx512vl(auVar100,auVar103);
    auVar89 = vminps_avx512vl(auVar89,auVar100);
    auVar99 = vmaxps_avx512vl(auVar109,auVar99);
    auVar99 = vmaxps_avx512vl(auVar101,auVar99);
    auVar99 = vmaxps_avx512vl(auVar90,auVar99);
    uVar27 = vcmpps_avx512vl(auVar89,local_3c0,2);
    uVar28 = vcmpps_avx512vl(auVar99,local_3e0,5);
    uVar56 = 0;
    bVar52 = (byte)uVar27 & (byte)uVar28 & 0x7f;
    if (bVar52 != 0) {
      auVar99 = vsubps_avx512vl(auVar96,auVar157);
      auVar89 = vsubps_avx512vl(auVar97,auVar164);
      auVar90 = vsubps_avx512vl(auVar105,auVar106);
      auVar99 = vaddps_avx512vl(auVar99,auVar90);
      auVar90 = vsubps_avx512vl(auVar94,auVar93);
      auVar89 = vaddps_avx512vl(auVar89,auVar90);
      auVar90 = vmulps_avx512vl(auVar164,auVar99);
      auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar89,auVar157);
      auVar91 = vmulps_avx512vl(auVar91,auVar99);
      auVar91 = vfnmadd213ps_avx512vl(auVar139,auVar89,auVar91);
      auVar98 = vmulps_avx512vl(auVar98,auVar99);
      auVar98 = vfnmadd213ps_avx512vl(auVar102,auVar89,auVar98);
      auVar102 = vmulps_avx512vl(auVar97,auVar99);
      auVar96 = vfnmadd231ps_avx512vl(auVar102,auVar89,auVar96);
      auVar102 = vmulps_avx512vl(auVar93,auVar99);
      auVar106 = vfnmadd231ps_avx512vl(auVar102,auVar89,auVar106);
      auVar102 = vmulps_avx512vl(auVar95,auVar99);
      auVar93 = vfnmadd213ps_avx512vl(auVar217,auVar89,auVar102);
      auVar102 = vmulps_avx512vl(auVar104,auVar99);
      auVar95 = vfnmadd213ps_avx512vl(auVar92,auVar89,auVar102);
      auVar102 = vmulps_avx512vl(auVar94,auVar99);
      auVar94 = vfnmadd231ps_avx512vl(auVar102,auVar105,auVar89);
      auVar92 = vminps_avx(auVar90,auVar91);
      auVar102 = vmaxps_avx(auVar90,auVar91);
      auVar104 = vminps_avx(auVar98,auVar96);
      auVar104 = vminps_avx(auVar92,auVar104);
      auVar92 = vmaxps_avx(auVar98,auVar96);
      auVar102 = vmaxps_avx(auVar102,auVar92);
      auVar105 = vminps_avx(auVar106,auVar93);
      auVar92 = vmaxps_avx(auVar106,auVar93);
      auVar106 = vminps_avx(auVar95,auVar94);
      auVar105 = vminps_avx(auVar105,auVar106);
      auVar105 = vminps_avx(auVar104,auVar105);
      auVar104 = vmaxps_avx(auVar95,auVar94);
      auVar92 = vmaxps_avx(auVar92,auVar104);
      auVar102 = vmaxps_avx(auVar102,auVar92);
      uVar27 = vcmpps_avx512vl(auVar102,local_3e0,5);
      uVar28 = vcmpps_avx512vl(auVar105,local_3c0,2);
      uVar56 = (uint)(bVar52 & (byte)uVar27 & (byte)uVar28);
    }
    if (uVar56 != 0) {
      auStack_5b0[uVar54] = uVar56;
      uVar27 = vmovlps_avx(auVar73);
      *(undefined8 *)(&uStack_460 + uVar54 * 2) = uVar27;
      uVar59 = vmovlps_avx512f(auVar77);
      auStack_3a0[uVar54] = uVar59;
      uVar54 = (ulong)((int)uVar54 + 1);
    }
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar269 = ZEXT1664(auVar73);
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar270 = ZEXT1664(auVar73);
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar271 = ZEXT1664(auVar73);
    auVar110._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar110._32_32_ = auVar122._32_32_;
    auVar272 = ZEXT3264(auVar110._0_32_);
    auVar273 = ZEXT464(0x3f800000);
    auVar127._16_48_ = auVar110._16_48_;
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar274 = ZEXT1664(auVar73);
    do {
      auVar122._32_32_ = auVar127._32_32_;
      auVar73 = auVar274._0_16_;
      auVar67 = auVar277._0_16_;
      if ((int)uVar54 == 0) {
        uVar130 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar30._4_4_ = uVar130;
        auVar30._0_4_ = uVar130;
        auVar30._8_4_ = uVar130;
        auVar30._12_4_ = uVar130;
        auVar30._16_4_ = uVar130;
        auVar30._20_4_ = uVar130;
        auVar30._24_4_ = uVar130;
        auVar30._28_4_ = uVar130;
        uVar27 = vcmpps_avx512vl(local_400,auVar30,2);
        uVar60 = (uint)uVar61 & (uint)uVar27;
        uVar61 = (ulong)uVar60;
        if (uVar60 == 0) {
          return;
        }
        goto LAB_01d6a69f;
      }
      uVar53 = (int)uVar54 - 1;
      uVar55 = (ulong)uVar53;
      uVar56 = (&uStack_460)[uVar55 * 2];
      fVar125 = afStack_45c[uVar55 * 2];
      uVar6 = auStack_5b0[uVar55];
      auVar266._8_8_ = 0;
      auVar266._0_8_ = auStack_3a0[uVar55];
      auVar268 = ZEXT1664(auVar266);
      lVar58 = 0;
      for (uVar59 = (ulong)uVar6; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
        lVar58 = lVar58 + 1;
      }
      uVar57 = uVar6 - 1 & uVar6;
      auStack_5b0[uVar55] = uVar57;
      if (uVar57 == 0) {
        uVar54 = (ulong)uVar53;
      }
      auVar140._0_4_ = (float)lVar58;
      auVar140._4_8_ = SUB128(ZEXT812(0),4);
      auVar140._12_4_ = 0;
      auVar64 = vmulss_avx512f(auVar140,SUB6416(ZEXT464(0x3e124925),0));
      lVar58 = lVar58 + 1;
      auVar74 = vmulss_avx512f(ZEXT416((uint)(float)lVar58),SUB6416(ZEXT464(0x3e124925),0));
      auVar76 = auVar273._0_16_;
      auVar75 = vsubss_avx512f(auVar76,auVar64);
      auVar64 = vmulss_avx512f(ZEXT416((uint)fVar125),auVar64);
      auVar75 = vfmadd231ss_avx512f(auVar64,ZEXT416(uVar56),auVar75);
      auVar64 = vsubss_avx512f(auVar76,auVar74);
      auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar125 * auVar74._0_4_)),ZEXT416(uVar56),auVar64);
      auVar74 = vsubss_avx512f(auVar64,auVar75);
      vucomiss_avx512f(auVar74);
      if (uVar6 == 0 || lVar58 == 0) break;
      auVar79 = vshufps_avx(auVar266,auVar266,0x50);
      vucomiss_avx512f(auVar74);
      auVar77 = vsubps_avx512vl(auVar73,auVar79);
      fVar125 = auVar79._0_4_;
      auVar151._0_4_ = fVar128 * fVar125;
      fVar218 = auVar79._4_4_;
      auVar151._4_4_ = fVar129 * fVar218;
      fVar229 = auVar79._8_4_;
      auVar151._8_4_ = fVar128 * fVar229;
      fVar230 = auVar79._12_4_;
      auVar151._12_4_ = fVar129 * fVar230;
      auVar161._0_4_ = fVar166 * fVar125;
      auVar161._4_4_ = fVar167 * fVar218;
      auVar161._8_4_ = fVar166 * fVar229;
      auVar161._12_4_ = fVar167 * fVar230;
      auVar170._0_4_ = fVar168 * fVar125;
      auVar170._4_4_ = fVar239 * fVar218;
      auVar170._8_4_ = fVar168 * fVar229;
      auVar170._12_4_ = fVar239 * fVar230;
      auVar133._0_4_ = fVar248 * fVar125;
      auVar133._4_4_ = fVar249 * fVar218;
      auVar133._8_4_ = fVar248 * fVar229;
      auVar133._12_4_ = fVar249 * fVar230;
      auVar79 = vfmadd231ps_fma(auVar151,auVar77,local_5c0);
      auVar80 = vfmadd231ps_fma(auVar161,auVar77,local_5d0);
      auVar78 = vfmadd231ps_avx512vl(auVar170,auVar77,auVar131);
      auVar77 = vfmadd231ps_fma(auVar133,auVar178,auVar77);
      auVar147._16_16_ = auVar79;
      auVar147._0_16_ = auVar79;
      auVar158._16_16_ = auVar80;
      auVar158._0_16_ = auVar80;
      auVar165._16_16_ = auVar78;
      auVar165._0_16_ = auVar78;
      uVar130 = auVar75._0_4_;
      auVar183._4_4_ = uVar130;
      auVar183._0_4_ = uVar130;
      auVar183._8_4_ = uVar130;
      auVar183._12_4_ = uVar130;
      uVar130 = auVar64._0_4_;
      auVar183._20_4_ = uVar130;
      auVar183._16_4_ = uVar130;
      auVar183._24_4_ = uVar130;
      auVar183._28_4_ = uVar130;
      auVar102 = vsubps_avx(auVar158,auVar147);
      auVar80 = vfmadd213ps_fma(auVar102,auVar183,auVar147);
      auVar102 = vsubps_avx(auVar165,auVar158);
      auVar88 = vfmadd213ps_fma(auVar102,auVar183,auVar158);
      auVar79 = vsubps_avx(auVar77,auVar78);
      auVar159._16_16_ = auVar79;
      auVar159._0_16_ = auVar79;
      auVar79 = vfmadd213ps_fma(auVar159,auVar183,auVar165);
      auVar102 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar80));
      auVar80 = vfmadd213ps_fma(auVar102,auVar183,ZEXT1632(auVar80));
      auVar102 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar88));
      auVar79 = vfmadd213ps_fma(auVar102,auVar183,ZEXT1632(auVar88));
      auVar102 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar80));
      auVar177 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar102,auVar183);
      auVar122._0_32_ = vmulps_avx512vl(auVar102,auVar272._0_32_);
      fVar125 = auVar74._0_4_ * 0.33333334;
      auVar171._0_8_ =
           CONCAT44(auVar177._4_4_ + fVar125 * auVar122._4_4_,
                    auVar177._0_4_ + fVar125 * auVar122._0_4_);
      auVar171._8_4_ = auVar177._8_4_ + fVar125 * auVar122._8_4_;
      auVar171._12_4_ = auVar177._12_4_ + fVar125 * auVar122._12_4_;
      auVar152._0_4_ = fVar125 * auVar122._16_4_;
      auVar152._4_4_ = fVar125 * auVar122._20_4_;
      auVar152._8_4_ = fVar125 * auVar122._24_4_;
      auVar152._12_4_ = fVar125 * auVar122._28_4_;
      auVar175 = vsubps_avx((undefined1  [16])0x0,auVar152);
      auVar86 = vshufpd_avx(auVar177,auVar177,3);
      auVar84 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar79 = vsubps_avx(auVar86,auVar177);
      auVar80 = vsubps_avx(auVar84,(undefined1  [16])0x0);
      auVar185._0_4_ = auVar80._0_4_ + auVar79._0_4_;
      auVar185._4_4_ = auVar80._4_4_ + auVar79._4_4_;
      auVar185._8_4_ = auVar80._8_4_ + auVar79._8_4_;
      auVar185._12_4_ = auVar80._12_4_ + auVar79._12_4_;
      auVar79 = vshufps_avx(auVar177,auVar177,0xb1);
      auVar80 = vshufps_avx(auVar171,auVar171,0xb1);
      auVar77 = vshufps_avx(auVar175,auVar175,0xb1);
      auVar88 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar241._4_4_ = auVar185._0_4_;
      auVar241._0_4_ = auVar185._0_4_;
      auVar241._8_4_ = auVar185._0_4_;
      auVar241._12_4_ = auVar185._0_4_;
      auVar78 = vshufps_avx(auVar185,auVar185,0x55);
      fVar125 = auVar78._0_4_;
      auVar200._0_4_ = auVar79._0_4_ * fVar125;
      fVar218 = auVar78._4_4_;
      auVar200._4_4_ = auVar79._4_4_ * fVar218;
      fVar229 = auVar78._8_4_;
      auVar200._8_4_ = auVar79._8_4_ * fVar229;
      fVar230 = auVar78._12_4_;
      auVar200._12_4_ = auVar79._12_4_ * fVar230;
      auVar213._0_4_ = auVar80._0_4_ * fVar125;
      auVar213._4_4_ = auVar80._4_4_ * fVar218;
      auVar213._8_4_ = auVar80._8_4_ * fVar229;
      auVar213._12_4_ = auVar80._12_4_ * fVar230;
      auVar221._0_4_ = auVar77._0_4_ * fVar125;
      auVar221._4_4_ = auVar77._4_4_ * fVar218;
      auVar221._8_4_ = auVar77._8_4_ * fVar229;
      auVar221._12_4_ = auVar77._12_4_ * fVar230;
      auVar186._0_4_ = auVar88._0_4_ * fVar125;
      auVar186._4_4_ = auVar88._4_4_ * fVar218;
      auVar186._8_4_ = auVar88._8_4_ * fVar229;
      auVar186._12_4_ = auVar88._12_4_ * fVar230;
      auVar79 = vfmadd231ps_fma(auVar200,auVar241,auVar177);
      auVar80 = vfmadd231ps_fma(auVar213,auVar241,auVar171);
      auVar78 = vfmadd231ps_fma(auVar221,auVar241,auVar175);
      auVar176 = vfmadd231ps_fma(auVar186,(undefined1  [16])0x0,auVar241);
      auVar85 = vshufpd_avx(auVar79,auVar79,1);
      auVar81 = vshufpd_avx(auVar80,auVar80,1);
      auVar82 = vshufpd_avx(auVar78,auVar78,1);
      auVar83 = vshufpd_avx(auVar176,auVar176,1);
      auVar77 = vminss_avx(auVar79,auVar80);
      auVar79 = vmaxss_avx(auVar80,auVar79);
      auVar88 = vminss_avx(auVar78,auVar176);
      auVar80 = vmaxss_avx(auVar176,auVar78);
      auVar88 = vminss_avx(auVar77,auVar88);
      auVar79 = vmaxss_avx(auVar80,auVar79);
      auVar78 = vminss_avx(auVar85,auVar81);
      auVar80 = vmaxss_avx(auVar81,auVar85);
      auVar85 = vminss_avx(auVar82,auVar83);
      auVar77 = vmaxss_avx(auVar83,auVar82);
      auVar78 = vminss_avx(auVar78,auVar85);
      auVar80 = vmaxss_avx(auVar77,auVar80);
      fVar229 = auVar88._0_4_;
      auVar127._16_48_ = auVar122._16_48_;
      fVar218 = auVar80._0_4_;
      fVar125 = auVar79._0_4_;
      if ((0.0001 <= fVar229) || (fVar218 <= -0.0001)) {
        uVar27 = vcmpps_avx512vl(auVar78,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar28 = vcmpps_avx512vl(auVar88,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar125 & ((byte)uVar28 | (byte)uVar27)) != 0) goto LAB_01d6b610;
        uVar27 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar80,5);
        uVar28 = vcmpps_avx512vl(auVar78,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar28 | (ushort)uVar27) & 1) == 0) goto LAB_01d6b610;
        bVar11 = true;
        auVar268 = ZEXT1664(auVar266);
      }
      else {
LAB_01d6b610:
        auVar81 = auVar276._0_16_;
        uVar27 = vcmpss_avx512f(auVar88,auVar81,1);
        bVar11 = (bool)((byte)uVar27 & 1);
        iVar124 = auVar273._0_4_;
        fVar230 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar124);
        uVar27 = vcmpss_avx512f(auVar79,auVar81,1);
        bVar11 = (bool)((byte)uVar27 & 1);
        fVar231 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar124);
        bVar11 = fVar230 != fVar231;
        iVar275 = auVar276._0_4_;
        auVar127._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar111._4_60_ = auVar127._4_60_;
        auVar111._0_4_ = (uint)bVar11 * iVar275 + (uint)!bVar11 * 0x7f800000;
        auVar85 = auVar111._0_16_;
        auVar113._16_48_ = auVar127._16_48_;
        auVar113._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar112._4_60_ = auVar113._4_60_;
        auVar112._0_4_ = (uint)bVar11 * iVar275 + (uint)!bVar11 * -0x800000;
        auVar77 = auVar112._0_16_;
        uVar27 = vcmpss_avx512f(auVar78,auVar81,1);
        bVar11 = (bool)((byte)uVar27 & 1);
        fVar148 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar124);
        if ((fVar230 != fVar148) || (NAN(fVar230) || NAN(fVar148))) {
          fVar230 = auVar78._0_4_;
          bVar11 = fVar230 == fVar229;
          if ((!bVar11) || (NAN(fVar230) || NAN(fVar229))) {
            auVar88 = vxorps_avx512vl(auVar88,auVar271._0_16_);
            auVar260._0_4_ = auVar88._0_4_ / (fVar230 - fVar229);
            auVar260._4_12_ = auVar88._4_12_;
            auVar88 = vsubss_avx512f(auVar76,auVar260);
            auVar78 = vfmadd213ss_avx512f(auVar88,auVar81,auVar260);
            auVar88 = auVar78;
          }
          else {
            vucomiss_avx512f(auVar81);
            auVar115._16_48_ = auVar127._16_48_;
            auVar115._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar114._4_60_ = auVar115._4_60_;
            auVar114._0_4_ = (uint)bVar11 * iVar275 + (uint)!bVar11 * 0x7f800000;
            auVar78 = auVar114._0_16_;
            auVar88 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar85 = vminss_avx(auVar85,auVar78);
          auVar77 = vmaxss_avx(auVar88,auVar77);
        }
        auVar268 = ZEXT1664(auVar266);
        uVar27 = vcmpss_avx512f(auVar80,auVar81,1);
        bVar11 = (bool)((byte)uVar27 & 1);
        fVar229 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar124);
        if ((fVar231 != fVar229) || (NAN(fVar231) || NAN(fVar229))) {
          bVar11 = fVar218 == fVar125;
          if ((!bVar11) || (NAN(fVar218) || NAN(fVar125))) {
            auVar79 = vxorps_avx512vl(auVar79,auVar271._0_16_);
            auVar222._0_4_ = auVar79._0_4_ / (fVar218 - fVar125);
            auVar222._4_12_ = auVar79._4_12_;
            auVar79 = vsubss_avx512f(auVar76,auVar222);
            auVar80 = vfmadd213ss_avx512f(auVar79,auVar81,auVar222);
            auVar79 = auVar80;
          }
          else {
            vucomiss_avx512f(auVar81);
            auVar117._16_48_ = auVar127._16_48_;
            auVar117._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar116._4_60_ = auVar117._4_60_;
            auVar116._0_4_ = (uint)bVar11 * iVar275 + (uint)!bVar11 * 0x7f800000;
            auVar80 = auVar116._0_16_;
            auVar79 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar85 = vminss_avx(auVar85,auVar80);
          auVar77 = vmaxss_avx(auVar79,auVar77);
        }
        bVar11 = fVar148 != fVar229;
        auVar79 = vminss_avx512f(auVar85,auVar76);
        auVar119._16_48_ = auVar127._16_48_;
        auVar119._0_16_ = auVar85;
        auVar118._4_60_ = auVar119._4_60_;
        auVar118._0_4_ = (uint)bVar11 * auVar79._0_4_ + (uint)!bVar11 * auVar85._0_4_;
        auVar79 = vmaxss_avx512f(auVar76,auVar77);
        auVar121._16_48_ = auVar127._16_48_;
        auVar121._0_16_ = auVar77;
        auVar120._4_60_ = auVar121._4_60_;
        auVar120._0_4_ = (uint)bVar11 * auVar79._0_4_ + (uint)!bVar11 * auVar77._0_4_;
        auVar79 = vmaxss_avx512f(auVar81,auVar118._0_16_);
        auVar80 = vminss_avx512f(auVar120._0_16_,auVar76);
        bVar11 = true;
        if (auVar79._0_4_ <= auVar80._0_4_) {
          auVar81 = vmaxss_avx512f(auVar81,ZEXT416((uint)(auVar79._0_4_ + -0.1)));
          auVar82 = vminss_avx512f(ZEXT416((uint)(auVar80._0_4_ + 0.1)),auVar76);
          auVar134._0_8_ = auVar177._0_8_;
          auVar134._8_8_ = auVar134._0_8_;
          auVar214._8_8_ = auVar171._0_8_;
          auVar214._0_8_ = auVar171._0_8_;
          auVar223._8_8_ = auVar175._0_8_;
          auVar223._0_8_ = auVar175._0_8_;
          auVar79 = vshufpd_avx(auVar171,auVar171,3);
          auVar80 = vshufpd_avx(auVar175,auVar175,3);
          auVar77 = vshufps_avx(auVar81,auVar82,0);
          auVar83 = vsubps_avx512vl(auVar73,auVar77);
          fVar125 = auVar77._0_4_;
          auVar252._0_4_ = fVar125 * auVar86._0_4_;
          fVar218 = auVar77._4_4_;
          auVar252._4_4_ = fVar218 * auVar86._4_4_;
          fVar229 = auVar77._8_4_;
          auVar252._8_4_ = fVar229 * auVar86._8_4_;
          fVar230 = auVar77._12_4_;
          auVar252._12_4_ = fVar230 * auVar86._12_4_;
          auVar172._0_4_ = fVar125 * auVar79._0_4_;
          auVar172._4_4_ = fVar218 * auVar79._4_4_;
          auVar172._8_4_ = fVar229 * auVar79._8_4_;
          auVar172._12_4_ = fVar230 * auVar79._12_4_;
          auVar179._0_4_ = fVar125 * auVar80._0_4_;
          auVar179._4_4_ = fVar218 * auVar80._4_4_;
          auVar179._8_4_ = fVar229 * auVar80._8_4_;
          auVar179._12_4_ = fVar230 * auVar80._12_4_;
          auVar153._0_4_ = fVar125 * auVar84._0_4_;
          auVar153._4_4_ = fVar218 * auVar84._4_4_;
          auVar153._8_4_ = fVar229 * auVar84._8_4_;
          auVar153._12_4_ = fVar230 * auVar84._12_4_;
          auVar88 = vfmadd231ps_fma(auVar252,auVar83,auVar134);
          auVar78 = vfmadd231ps_fma(auVar172,auVar83,auVar214);
          auVar85 = vfmadd231ps_fma(auVar179,auVar83,auVar223);
          auVar86 = vfmadd231ps_fma(auVar153,auVar83,ZEXT816(0));
          auVar80 = vsubss_avx512f(auVar76,auVar81);
          auVar79 = vmovshdup_avx(auVar266);
          auVar176 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar81._0_4_)),auVar266,auVar80
                                    );
          auVar80 = vsubss_avx512f(auVar76,auVar82);
          auVar177 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar79._0_4_)),auVar266,auVar80
                                    );
          auVar84 = vdivss_avx512f(auVar76,auVar74);
          auVar74 = vsubps_avx(auVar78,auVar88);
          auVar141._0_4_ = auVar74._0_4_ * 3.0;
          auVar141._4_4_ = auVar74._4_4_ * 3.0;
          auVar141._8_4_ = auVar74._8_4_ * 3.0;
          auVar141._12_4_ = auVar74._12_4_ * 3.0;
          auVar74 = vsubps_avx(auVar85,auVar78);
          auVar187._0_4_ = auVar74._0_4_ * 3.0;
          auVar187._4_4_ = auVar74._4_4_ * 3.0;
          auVar187._8_4_ = auVar74._8_4_ * 3.0;
          auVar187._12_4_ = auVar74._12_4_ * 3.0;
          auVar74 = vsubps_avx(auVar86,auVar85);
          auVar201._0_4_ = auVar74._0_4_ * 3.0;
          auVar201._4_4_ = auVar74._4_4_ * 3.0;
          auVar201._8_4_ = auVar74._8_4_ * 3.0;
          auVar201._12_4_ = auVar74._12_4_ * 3.0;
          auVar79 = vminps_avx(auVar187,auVar201);
          auVar74 = vmaxps_avx(auVar187,auVar201);
          auVar79 = vminps_avx(auVar141,auVar79);
          auVar74 = vmaxps_avx(auVar141,auVar74);
          auVar80 = vshufpd_avx(auVar79,auVar79,3);
          auVar77 = vshufpd_avx(auVar74,auVar74,3);
          auVar79 = vminps_avx(auVar79,auVar80);
          auVar74 = vmaxps_avx(auVar74,auVar77);
          fVar125 = auVar84._0_4_;
          auVar202._0_4_ = fVar125 * auVar79._0_4_;
          auVar202._4_4_ = fVar125 * auVar79._4_4_;
          auVar202._8_4_ = fVar125 * auVar79._8_4_;
          auVar202._12_4_ = fVar125 * auVar79._12_4_;
          auVar188._0_4_ = fVar125 * auVar74._0_4_;
          auVar188._4_4_ = fVar125 * auVar74._4_4_;
          auVar188._8_4_ = fVar125 * auVar74._8_4_;
          auVar188._12_4_ = fVar125 * auVar74._12_4_;
          auVar84 = vdivss_avx512f(auVar76,ZEXT416((uint)(auVar177._0_4_ - auVar176._0_4_)));
          auVar74 = vshufpd_avx(auVar88,auVar88,3);
          auVar79 = vshufpd_avx(auVar78,auVar78,3);
          auVar80 = vshufpd_avx(auVar85,auVar85,3);
          auVar77 = vshufpd_avx(auVar86,auVar86,3);
          auVar74 = vsubps_avx(auVar74,auVar88);
          auVar88 = vsubps_avx(auVar79,auVar78);
          auVar78 = vsubps_avx(auVar80,auVar85);
          auVar77 = vsubps_avx(auVar77,auVar86);
          auVar79 = vminps_avx(auVar74,auVar88);
          auVar74 = vmaxps_avx(auVar74,auVar88);
          auVar80 = vminps_avx(auVar78,auVar77);
          auVar80 = vminps_avx(auVar79,auVar80);
          auVar79 = vmaxps_avx(auVar78,auVar77);
          auVar74 = vmaxps_avx(auVar74,auVar79);
          fVar125 = auVar84._0_4_;
          auVar224._0_4_ = fVar125 * auVar80._0_4_;
          auVar224._4_4_ = fVar125 * auVar80._4_4_;
          auVar224._8_4_ = fVar125 * auVar80._8_4_;
          auVar224._12_4_ = fVar125 * auVar80._12_4_;
          auVar234._0_4_ = fVar125 * auVar74._0_4_;
          auVar234._4_4_ = fVar125 * auVar74._4_4_;
          auVar234._8_4_ = fVar125 * auVar74._8_4_;
          auVar234._12_4_ = fVar125 * auVar74._12_4_;
          auVar175 = vinsertps_avx512f(auVar75,auVar176,0x10);
          auVar88 = vinsertps_avx(auVar64,auVar177,0x10);
          auVar126._0_4_ = auVar175._0_4_ + auVar88._0_4_;
          auVar126._4_4_ = auVar175._4_4_ + auVar88._4_4_;
          auVar126._8_4_ = auVar175._8_4_ + auVar88._8_4_;
          auVar126._12_4_ = auVar175._12_4_ + auVar88._12_4_;
          auVar82 = vmulps_avx512vl(auVar126,auVar269._0_16_);
          auVar80 = vshufps_avx(auVar82,auVar82,0x54);
          uVar130 = auVar82._0_4_;
          auVar142._4_4_ = uVar130;
          auVar142._0_4_ = uVar130;
          auVar142._8_4_ = uVar130;
          auVar142._12_4_ = uVar130;
          auVar78 = vfmadd213ps_avx512vl(auVar62,auVar142,auVar72);
          auVar79 = vfmadd213ps_fma(auVar70,auVar142,auVar71);
          auVar77 = vfmadd213ps_fma(auVar68,auVar142,auVar69);
          auVar74 = vsubps_avx(auVar79,auVar78);
          auVar78 = vfmadd213ps_fma(auVar74,auVar142,auVar78);
          auVar74 = vsubps_avx(auVar77,auVar79);
          auVar74 = vfmadd213ps_fma(auVar74,auVar142,auVar79);
          auVar74 = vsubps_avx(auVar74,auVar78);
          auVar79 = vfmadd231ps_fma(auVar78,auVar74,auVar142);
          auVar143._0_8_ = CONCAT44(auVar74._4_4_ * 3.0,auVar74._0_4_ * 3.0);
          auVar143._8_4_ = auVar74._8_4_ * 3.0;
          auVar143._12_4_ = auVar74._12_4_ * 3.0;
          auVar242._8_8_ = auVar79._0_8_;
          auVar242._0_8_ = auVar79._0_8_;
          auVar74 = vshufpd_avx(auVar79,auVar79,3);
          auVar79 = vshufps_avx(auVar82,auVar82,0x55);
          auVar77 = vsubps_avx(auVar74,auVar242);
          auVar78 = vfmadd231ps_fma(auVar242,auVar79,auVar77);
          auVar261._8_8_ = auVar143._0_8_;
          auVar261._0_8_ = auVar143._0_8_;
          auVar74 = vshufpd_avx(auVar143,auVar143,3);
          auVar74 = vsubps_avx(auVar74,auVar261);
          auVar79 = vfmadd213ps_fma(auVar74,auVar79,auVar261);
          auVar144._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
          auVar144._8_4_ = auVar77._8_4_ ^ 0x80000000;
          auVar144._12_4_ = auVar77._12_4_ ^ 0x80000000;
          auVar74 = vmovshdup_avx(auVar79);
          auVar262._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
          auVar262._8_4_ = auVar74._8_4_ ^ 0x80000000;
          auVar262._12_4_ = auVar74._12_4_ ^ 0x80000000;
          auVar85 = vmovshdup_avx512vl(auVar77);
          auVar86 = vpermt2ps_avx512vl(auVar262,ZEXT416(5),auVar77);
          auVar74 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar74._0_4_ * auVar77._0_4_)),auVar79,
                                        auVar85);
          auVar79 = vpermt2ps_avx512vl(auVar79,SUB6416(ZEXT464(4),0),auVar144);
          auVar154._0_4_ = auVar74._0_4_;
          auVar154._4_4_ = auVar154._0_4_;
          auVar154._8_4_ = auVar154._0_4_;
          auVar154._12_4_ = auVar154._0_4_;
          auVar74 = vdivps_avx(auVar86,auVar154);
          auVar79 = vdivps_avx(auVar79,auVar154);
          fVar218 = auVar78._0_4_;
          auVar77 = vshufps_avx(auVar78,auVar78,0x55);
          fVar125 = auVar79._0_4_;
          auVar243._0_4_ = fVar218 * auVar74._0_4_ + auVar77._0_4_ * fVar125;
          auVar243._4_4_ = fVar218 * auVar74._4_4_ + auVar77._4_4_ * auVar79._4_4_;
          auVar243._8_4_ = fVar218 * auVar74._8_4_ + auVar77._8_4_ * auVar79._8_4_;
          auVar243._12_4_ = fVar218 * auVar74._12_4_ + auVar77._12_4_ * auVar79._12_4_;
          auVar83 = vsubps_avx(auVar80,auVar243);
          auVar78 = vmovshdup_avx(auVar74);
          auVar80 = vinsertps_avx(auVar202,auVar224,0x1c);
          auVar263._0_4_ = auVar78._0_4_ * auVar80._0_4_;
          auVar263._4_4_ = auVar78._4_4_ * auVar80._4_4_;
          auVar263._8_4_ = auVar78._8_4_ * auVar80._8_4_;
          auVar263._12_4_ = auVar78._12_4_ * auVar80._12_4_;
          auVar77 = vinsertps_avx(auVar188,auVar234,0x1c);
          auVar244._0_4_ = auVar78._0_4_ * auVar77._0_4_;
          auVar244._4_4_ = auVar78._4_4_ * auVar77._4_4_;
          auVar244._8_4_ = auVar78._8_4_ * auVar77._8_4_;
          auVar244._12_4_ = auVar78._12_4_ * auVar77._12_4_;
          auVar81 = vminps_avx512vl(auVar263,auVar244);
          auVar86 = vmaxps_avx(auVar244,auVar263);
          auVar84 = vmovshdup_avx(auVar79);
          auVar78 = vinsertps_avx(auVar224,auVar202,0x4c);
          auVar225._0_4_ = auVar84._0_4_ * auVar78._0_4_;
          auVar225._4_4_ = auVar84._4_4_ * auVar78._4_4_;
          auVar225._8_4_ = auVar84._8_4_ * auVar78._8_4_;
          auVar225._12_4_ = auVar84._12_4_ * auVar78._12_4_;
          auVar85 = vinsertps_avx(auVar234,auVar188,0x4c);
          auVar235._0_4_ = auVar84._0_4_ * auVar85._0_4_;
          auVar235._4_4_ = auVar84._4_4_ * auVar85._4_4_;
          auVar235._8_4_ = auVar84._8_4_ * auVar85._8_4_;
          auVar235._12_4_ = auVar84._12_4_ * auVar85._12_4_;
          auVar84 = vminps_avx(auVar225,auVar235);
          auVar81 = vaddps_avx512vl(auVar81,auVar84);
          auVar84 = vmaxps_avx(auVar235,auVar225);
          auVar226._0_4_ = auVar86._0_4_ + auVar84._0_4_;
          auVar226._4_4_ = auVar86._4_4_ + auVar84._4_4_;
          auVar226._8_4_ = auVar86._8_4_ + auVar84._8_4_;
          auVar226._12_4_ = auVar86._12_4_ + auVar84._12_4_;
          auVar236._8_8_ = 0x3f80000000000000;
          auVar236._0_8_ = 0x3f80000000000000;
          auVar86 = vsubps_avx(auVar236,auVar226);
          auVar84 = vsubps_avx(auVar236,auVar81);
          auVar81 = vsubps_avx(auVar175,auVar82);
          auVar82 = vsubps_avx(auVar88,auVar82);
          fVar148 = auVar81._0_4_;
          auVar264._0_4_ = fVar148 * auVar86._0_4_;
          fVar232 = auVar81._4_4_;
          auVar264._4_4_ = fVar232 * auVar86._4_4_;
          fVar250 = auVar81._8_4_;
          auVar264._8_4_ = fVar250 * auVar86._8_4_;
          fVar251 = auVar81._12_4_;
          auVar264._12_4_ = fVar251 * auVar86._12_4_;
          auVar87 = vbroadcastss_avx512vl(auVar74);
          auVar80 = vmulps_avx512vl(auVar87,auVar80);
          auVar77 = vmulps_avx512vl(auVar87,auVar77);
          auVar87 = vminps_avx512vl(auVar80,auVar77);
          auVar80 = vmaxps_avx(auVar77,auVar80);
          auVar203._0_4_ = fVar125 * auVar78._0_4_;
          auVar203._4_4_ = fVar125 * auVar78._4_4_;
          auVar203._8_4_ = fVar125 * auVar78._8_4_;
          auVar203._12_4_ = fVar125 * auVar78._12_4_;
          auVar189._0_4_ = fVar125 * auVar85._0_4_;
          auVar189._4_4_ = fVar125 * auVar85._4_4_;
          auVar189._8_4_ = fVar125 * auVar85._8_4_;
          auVar189._12_4_ = fVar125 * auVar85._12_4_;
          auVar77 = vminps_avx(auVar203,auVar189);
          auVar78 = vaddps_avx512vl(auVar87,auVar77);
          auVar85 = vmulps_avx512vl(auVar81,auVar84);
          fVar218 = auVar82._0_4_;
          auVar227._0_4_ = fVar218 * auVar86._0_4_;
          fVar229 = auVar82._4_4_;
          auVar227._4_4_ = fVar229 * auVar86._4_4_;
          fVar230 = auVar82._8_4_;
          auVar227._8_4_ = fVar230 * auVar86._8_4_;
          fVar231 = auVar82._12_4_;
          auVar227._12_4_ = fVar231 * auVar86._12_4_;
          auVar237._0_4_ = fVar218 * auVar84._0_4_;
          auVar237._4_4_ = fVar229 * auVar84._4_4_;
          auVar237._8_4_ = fVar230 * auVar84._8_4_;
          auVar237._12_4_ = fVar231 * auVar84._12_4_;
          auVar77 = vmaxps_avx(auVar189,auVar203);
          auVar190._0_4_ = auVar80._0_4_ + auVar77._0_4_;
          auVar190._4_4_ = auVar80._4_4_ + auVar77._4_4_;
          auVar190._8_4_ = auVar80._8_4_ + auVar77._8_4_;
          auVar190._12_4_ = auVar80._12_4_ + auVar77._12_4_;
          auVar204._8_8_ = 0x3f800000;
          auVar204._0_8_ = 0x3f800000;
          auVar80 = vsubps_avx(auVar204,auVar190);
          auVar77 = vsubps_avx(auVar204,auVar78);
          auVar253._0_4_ = fVar148 * auVar80._0_4_;
          auVar253._4_4_ = fVar232 * auVar80._4_4_;
          auVar253._8_4_ = fVar250 * auVar80._8_4_;
          auVar253._12_4_ = fVar251 * auVar80._12_4_;
          auVar245._0_4_ = fVar148 * auVar77._0_4_;
          auVar245._4_4_ = fVar232 * auVar77._4_4_;
          auVar245._8_4_ = fVar250 * auVar77._8_4_;
          auVar245._12_4_ = fVar251 * auVar77._12_4_;
          auVar191._0_4_ = fVar218 * auVar80._0_4_;
          auVar191._4_4_ = fVar229 * auVar80._4_4_;
          auVar191._8_4_ = fVar230 * auVar80._8_4_;
          auVar191._12_4_ = fVar231 * auVar80._12_4_;
          auVar205._0_4_ = fVar218 * auVar77._0_4_;
          auVar205._4_4_ = fVar229 * auVar77._4_4_;
          auVar205._8_4_ = fVar230 * auVar77._8_4_;
          auVar205._12_4_ = fVar231 * auVar77._12_4_;
          auVar80 = vminps_avx(auVar253,auVar245);
          auVar77 = vminps_avx(auVar191,auVar205);
          auVar78 = vminps_avx(auVar80,auVar77);
          auVar80 = vmaxps_avx(auVar245,auVar253);
          auVar77 = vmaxps_avx(auVar205,auVar191);
          auVar77 = vmaxps_avx(auVar77,auVar80);
          auVar86 = vminps_avx512vl(auVar264,auVar85);
          auVar80 = vminps_avx(auVar227,auVar237);
          auVar80 = vminps_avx(auVar86,auVar80);
          auVar80 = vhaddps_avx(auVar78,auVar80);
          auVar85 = vmaxps_avx512vl(auVar85,auVar264);
          auVar78 = vmaxps_avx(auVar237,auVar227);
          auVar78 = vmaxps_avx(auVar78,auVar85);
          auVar77 = vhaddps_avx(auVar77,auVar78);
          auVar80 = vshufps_avx(auVar80,auVar80,0xe8);
          auVar77 = vshufps_avx(auVar77,auVar77,0xe8);
          auVar192._0_4_ = auVar80._0_4_ + auVar83._0_4_;
          auVar192._4_4_ = auVar80._4_4_ + auVar83._4_4_;
          auVar192._8_4_ = auVar80._8_4_ + auVar83._8_4_;
          auVar192._12_4_ = auVar80._12_4_ + auVar83._12_4_;
          auVar206._0_4_ = auVar77._0_4_ + auVar83._0_4_;
          auVar206._4_4_ = auVar77._4_4_ + auVar83._4_4_;
          auVar206._8_4_ = auVar77._8_4_ + auVar83._8_4_;
          auVar206._12_4_ = auVar77._12_4_ + auVar83._12_4_;
          auVar80 = vmaxps_avx(auVar175,auVar192);
          auVar77 = vminps_avx(auVar206,auVar88);
          uVar59 = vcmpps_avx512vl(auVar77,auVar80,1);
          local_600 = vinsertps_avx(auVar176,auVar177,0x10);
          auVar268 = ZEXT1664(local_600);
          auVar80 = ZEXT416(5);
          if ((uVar59 & 3) == 0) {
            vucomiss_avx512f(auVar75);
            auVar80 = vxorps_avx512vl(auVar80,auVar80);
            auVar276 = ZEXT1664(auVar80);
            if ((uint)uVar54 < 4 && (uVar6 == 0 || lVar58 == 0)) {
              bVar11 = false;
            }
            else {
              lVar58 = 200;
              do {
                auVar77 = vsubss_avx512f(auVar76,auVar83);
                fVar230 = auVar77._0_4_;
                fVar218 = fVar230 * fVar230 * fVar230;
                fVar231 = auVar83._0_4_;
                fVar229 = fVar231 * 3.0 * fVar230 * fVar230;
                fVar230 = fVar230 * fVar231 * fVar231 * 3.0;
                auVar173._4_4_ = fVar218;
                auVar173._0_4_ = fVar218;
                auVar173._8_4_ = fVar218;
                auVar173._12_4_ = fVar218;
                auVar162._4_4_ = fVar229;
                auVar162._0_4_ = fVar229;
                auVar162._8_4_ = fVar229;
                auVar162._12_4_ = fVar229;
                auVar135._4_4_ = fVar230;
                auVar135._0_4_ = fVar230;
                auVar135._8_4_ = fVar230;
                auVar135._12_4_ = fVar230;
                fVar231 = fVar231 * fVar231 * fVar231;
                auVar180._0_4_ = (float)local_5e0._0_4_ * fVar231;
                auVar180._4_4_ = (float)local_5e0._4_4_ * fVar231;
                auVar180._8_4_ = fStack_5d8 * fVar231;
                auVar180._12_4_ = fStack_5d4 * fVar231;
                auVar77 = vfmadd231ps_fma(auVar180,auVar69,auVar135);
                auVar77 = vfmadd231ps_fma(auVar77,auVar71,auVar162);
                auVar77 = vfmadd231ps_fma(auVar77,auVar72,auVar173);
                auVar136._8_8_ = auVar77._0_8_;
                auVar136._0_8_ = auVar77._0_8_;
                auVar77 = vshufpd_avx(auVar77,auVar77,3);
                auVar88 = vshufps_avx(auVar83,auVar83,0x55);
                auVar77 = vsubps_avx(auVar77,auVar136);
                auVar88 = vfmadd213ps_fma(auVar77,auVar88,auVar136);
                fVar218 = auVar88._0_4_;
                auVar77 = vshufps_avx(auVar88,auVar88,0x55);
                auVar137._0_4_ = auVar74._0_4_ * fVar218 + fVar125 * auVar77._0_4_;
                auVar137._4_4_ = auVar74._4_4_ * fVar218 + auVar79._4_4_ * auVar77._4_4_;
                auVar137._8_4_ = auVar74._8_4_ * fVar218 + auVar79._8_4_ * auVar77._8_4_;
                auVar137._12_4_ = auVar74._12_4_ * fVar218 + auVar79._12_4_ * auVar77._12_4_;
                auVar83 = vsubps_avx(auVar83,auVar137);
                auVar77 = vandps_avx512vl(auVar88,auVar270._0_16_);
                auVar88 = vprolq_avx512vl(auVar77,0x20);
                auVar77 = vmaxss_avx(auVar88,auVar77);
                bVar26 = auVar77._0_4_ <= (float)local_5f0._0_4_;
                if (auVar77._0_4_ < (float)local_5f0._0_4_) {
                  auVar74 = vucomiss_avx512f(auVar80);
                  if (bVar26) {
                    auVar76 = vucomiss_avx512f(auVar74);
                    auVar273 = ZEXT1664(auVar76);
                    if (bVar26) {
                      vmovshdup_avx(auVar74);
                      auVar76 = vucomiss_avx512f(auVar80);
                      if (bVar26) {
                        auVar79 = vucomiss_avx512f(auVar76);
                        auVar273 = ZEXT1664(auVar79);
                        if (bVar26) {
                          auVar77 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar82 = vinsertps_avx(auVar77,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar77 = vdpps_avx(auVar82,local_470,0x7f);
                          auVar88 = vdpps_avx(auVar82,local_480,0x7f);
                          auVar78 = vdpps_avx(auVar82,local_490,0x7f);
                          auVar85 = vdpps_avx(auVar82,local_4a0,0x7f);
                          auVar86 = vdpps_avx(auVar82,local_4b0,0x7f);
                          auVar84 = vdpps_avx(auVar82,local_4c0,0x7f);
                          auVar81 = vdpps_avx(auVar82,local_4d0,0x7f);
                          auVar82 = vdpps_avx(auVar82,local_4e0,0x7f);
                          auVar83 = vsubss_avx512f(auVar79,auVar76);
                          fVar231 = auVar76._0_4_;
                          auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * auVar86._0_4_)),auVar83
                                                    ,auVar77);
                          auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ * fVar231)),auVar83
                                                    ,auVar88);
                          auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ * fVar231)),auVar83
                                                    ,auVar78);
                          auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * auVar82._0_4_)),auVar83
                                                    ,auVar85);
                          auVar79 = vsubss_avx512f(auVar79,auVar74);
                          auVar193._0_4_ = auVar79._0_4_;
                          fVar125 = auVar193._0_4_ * auVar193._0_4_ * auVar193._0_4_;
                          fVar230 = auVar74._0_4_;
                          fVar218 = fVar230 * 3.0 * auVar193._0_4_ * auVar193._0_4_;
                          fVar229 = auVar193._0_4_ * fVar230 * fVar230 * 3.0;
                          fVar232 = fVar230 * fVar230 * fVar230;
                          auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar232 * auVar78._0_4_)),
                                                    ZEXT416((uint)fVar229),auVar88);
                          auVar79 = vfmadd231ss_fma(auVar79,ZEXT416((uint)fVar218),auVar77);
                          auVar76 = vfmadd231ss_fma(auVar79,ZEXT416((uint)fVar125),auVar76);
                          fVar148 = auVar76._0_4_;
                          if ((fVar149 <= fVar148) &&
                             (fVar250 = *(float *)(ray + k * 4 + 0x200), fVar148 <= fVar250)) {
                            auVar76 = vshufps_avx(auVar74,auVar74,0x55);
                            auVar77 = vsubps_avx512vl(auVar73,auVar76);
                            fVar251 = auVar76._0_4_;
                            auVar228._0_4_ = fVar251 * (float)local_500._0_4_;
                            fVar256 = auVar76._4_4_;
                            auVar228._4_4_ = fVar256 * (float)local_500._4_4_;
                            fVar257 = auVar76._8_4_;
                            auVar228._8_4_ = fVar257 * fStack_4f8;
                            fVar258 = auVar76._12_4_;
                            auVar228._12_4_ = fVar258 * fStack_4f4;
                            auVar238._0_4_ = fVar251 * (float)local_550._0_4_;
                            auVar238._4_4_ = fVar256 * (float)local_550._4_4_;
                            auVar238._8_4_ = fVar257 * fStack_548;
                            auVar238._12_4_ = fVar258 * fStack_544;
                            auVar246._0_4_ = fVar251 * (float)local_560._0_4_;
                            auVar246._4_4_ = fVar256 * (float)local_560._4_4_;
                            auVar246._8_4_ = fVar257 * fStack_558;
                            auVar246._12_4_ = fVar258 * fStack_554;
                            auVar207._0_4_ = fVar251 * (float)local_520._0_4_;
                            auVar207._4_4_ = fVar256 * (float)local_520._4_4_;
                            auVar207._8_4_ = fVar257 * fStack_518;
                            auVar207._12_4_ = fVar258 * fStack_514;
                            auVar73 = vfmadd231ps_fma(auVar228,auVar77,local_4f0);
                            auVar76 = vfmadd231ps_fma(auVar238,auVar77,local_530);
                            auVar79 = vfmadd231ps_fma(auVar246,auVar77,local_540);
                            auVar77 = vfmadd231ps_fma(auVar207,auVar77,local_510);
                            auVar73 = vsubps_avx(auVar76,auVar73);
                            auVar76 = vsubps_avx(auVar79,auVar76);
                            auVar79 = vsubps_avx(auVar77,auVar79);
                            auVar247._0_4_ = fVar230 * auVar76._0_4_;
                            auVar247._4_4_ = fVar230 * auVar76._4_4_;
                            auVar247._8_4_ = fVar230 * auVar76._8_4_;
                            auVar247._12_4_ = fVar230 * auVar76._12_4_;
                            auVar193._4_4_ = auVar193._0_4_;
                            auVar193._8_4_ = auVar193._0_4_;
                            auVar193._12_4_ = auVar193._0_4_;
                            auVar73 = vfmadd231ps_fma(auVar247,auVar193,auVar73);
                            auVar208._0_4_ = fVar230 * auVar79._0_4_;
                            auVar208._4_4_ = fVar230 * auVar79._4_4_;
                            auVar208._8_4_ = fVar230 * auVar79._8_4_;
                            auVar208._12_4_ = fVar230 * auVar79._12_4_;
                            auVar76 = vfmadd231ps_fma(auVar208,auVar193,auVar76);
                            auVar209._0_4_ = fVar230 * auVar76._0_4_;
                            auVar209._4_4_ = fVar230 * auVar76._4_4_;
                            auVar209._8_4_ = fVar230 * auVar76._8_4_;
                            auVar209._12_4_ = fVar230 * auVar76._12_4_;
                            auVar73 = vfmadd231ps_fma(auVar209,auVar193,auVar73);
                            auVar29._8_4_ = 0x40400000;
                            auVar29._0_8_ = 0x4040000040400000;
                            auVar29._12_4_ = 0x40400000;
                            auVar73 = vmulps_avx512vl(auVar73,auVar29);
                            pGVar7 = (context->scene->geometries).items[uVar60].ptr;
                            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                              auVar181._0_4_ = fVar232 * (float)local_5a0._0_4_;
                              auVar181._4_4_ = fVar232 * (float)local_5a0._4_4_;
                              auVar181._8_4_ = fVar232 * fStack_598;
                              auVar181._12_4_ = fVar232 * fStack_594;
                              auVar174._4_4_ = fVar229;
                              auVar174._0_4_ = fVar229;
                              auVar174._8_4_ = fVar229;
                              auVar174._12_4_ = fVar229;
                              auVar76 = vfmadd132ps_fma(auVar174,auVar181,local_590);
                              auVar163._4_4_ = fVar218;
                              auVar163._0_4_ = fVar218;
                              auVar163._8_4_ = fVar218;
                              auVar163._12_4_ = fVar218;
                              auVar76 = vfmadd132ps_fma(auVar163,auVar76,local_580);
                              auVar155._4_4_ = fVar125;
                              auVar155._0_4_ = fVar125;
                              auVar155._8_4_ = fVar125;
                              auVar155._12_4_ = fVar125;
                              auVar77 = vfmadd132ps_fma(auVar155,auVar76,local_570);
                              auVar76 = vshufps_avx(auVar77,auVar77,0xc9);
                              auVar79 = vshufps_avx(auVar73,auVar73,0xc9);
                              auVar156._0_4_ = auVar77._0_4_ * auVar79._0_4_;
                              auVar156._4_4_ = auVar77._4_4_ * auVar79._4_4_;
                              auVar156._8_4_ = auVar77._8_4_ * auVar79._8_4_;
                              auVar156._12_4_ = auVar77._12_4_ * auVar79._12_4_;
                              auVar73 = vfmsub231ps_fma(auVar156,auVar73,auVar76);
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x200) = fVar148;
                                uVar130 = vextractps_avx(auVar73,1);
                                *(undefined4 *)(ray + k * 4 + 0x300) = uVar130;
                                uVar130 = vextractps_avx(auVar73,2);
                                *(undefined4 *)(ray + k * 4 + 0x340) = uVar130;
                                *(int *)(ray + k * 4 + 0x380) = auVar73._0_4_;
                                *(float *)(ray + k * 4 + 0x3c0) = fVar230;
                                *(float *)(ray + k * 4 + 0x400) = fVar231;
                                *(uint *)(ray + k * 4 + 0x440) = uVar5;
                                *(uint *)(ray + k * 4 + 0x480) = uVar60;
                                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                              }
                              else {
                                local_200 = vbroadcastss_avx512f(auVar74);
                                auVar127 = vbroadcastss_avx512f(ZEXT416(1));
                                local_1c0 = vpermps_avx512f(auVar127,ZEXT1664(auVar74));
                                auVar127 = vpermps_avx512f(auVar127,ZEXT1664(auVar73));
                                auVar274 = vbroadcastss_avx512f(ZEXT416(2));
                                local_280 = vpermps_avx512f(auVar274,ZEXT1664(auVar73));
                                local_240 = vbroadcastss_avx512f(auVar73);
                                local_2c0[0] = (RTCHitN)auVar127[0];
                                local_2c0[1] = (RTCHitN)auVar127[1];
                                local_2c0[2] = (RTCHitN)auVar127[2];
                                local_2c0[3] = (RTCHitN)auVar127[3];
                                local_2c0[4] = (RTCHitN)auVar127[4];
                                local_2c0[5] = (RTCHitN)auVar127[5];
                                local_2c0[6] = (RTCHitN)auVar127[6];
                                local_2c0[7] = (RTCHitN)auVar127[7];
                                local_2c0[8] = (RTCHitN)auVar127[8];
                                local_2c0[9] = (RTCHitN)auVar127[9];
                                local_2c0[10] = (RTCHitN)auVar127[10];
                                local_2c0[0xb] = (RTCHitN)auVar127[0xb];
                                local_2c0[0xc] = (RTCHitN)auVar127[0xc];
                                local_2c0[0xd] = (RTCHitN)auVar127[0xd];
                                local_2c0[0xe] = (RTCHitN)auVar127[0xe];
                                local_2c0[0xf] = (RTCHitN)auVar127[0xf];
                                local_2c0[0x10] = (RTCHitN)auVar127[0x10];
                                local_2c0[0x11] = (RTCHitN)auVar127[0x11];
                                local_2c0[0x12] = (RTCHitN)auVar127[0x12];
                                local_2c0[0x13] = (RTCHitN)auVar127[0x13];
                                local_2c0[0x14] = (RTCHitN)auVar127[0x14];
                                local_2c0[0x15] = (RTCHitN)auVar127[0x15];
                                local_2c0[0x16] = (RTCHitN)auVar127[0x16];
                                local_2c0[0x17] = (RTCHitN)auVar127[0x17];
                                local_2c0[0x18] = (RTCHitN)auVar127[0x18];
                                local_2c0[0x19] = (RTCHitN)auVar127[0x19];
                                local_2c0[0x1a] = (RTCHitN)auVar127[0x1a];
                                local_2c0[0x1b] = (RTCHitN)auVar127[0x1b];
                                local_2c0[0x1c] = (RTCHitN)auVar127[0x1c];
                                local_2c0[0x1d] = (RTCHitN)auVar127[0x1d];
                                local_2c0[0x1e] = (RTCHitN)auVar127[0x1e];
                                local_2c0[0x1f] = (RTCHitN)auVar127[0x1f];
                                local_2c0[0x20] = (RTCHitN)auVar127[0x20];
                                local_2c0[0x21] = (RTCHitN)auVar127[0x21];
                                local_2c0[0x22] = (RTCHitN)auVar127[0x22];
                                local_2c0[0x23] = (RTCHitN)auVar127[0x23];
                                local_2c0[0x24] = (RTCHitN)auVar127[0x24];
                                local_2c0[0x25] = (RTCHitN)auVar127[0x25];
                                local_2c0[0x26] = (RTCHitN)auVar127[0x26];
                                local_2c0[0x27] = (RTCHitN)auVar127[0x27];
                                local_2c0[0x28] = (RTCHitN)auVar127[0x28];
                                local_2c0[0x29] = (RTCHitN)auVar127[0x29];
                                local_2c0[0x2a] = (RTCHitN)auVar127[0x2a];
                                local_2c0[0x2b] = (RTCHitN)auVar127[0x2b];
                                local_2c0[0x2c] = (RTCHitN)auVar127[0x2c];
                                local_2c0[0x2d] = (RTCHitN)auVar127[0x2d];
                                local_2c0[0x2e] = (RTCHitN)auVar127[0x2e];
                                local_2c0[0x2f] = (RTCHitN)auVar127[0x2f];
                                local_2c0[0x30] = (RTCHitN)auVar127[0x30];
                                local_2c0[0x31] = (RTCHitN)auVar127[0x31];
                                local_2c0[0x32] = (RTCHitN)auVar127[0x32];
                                local_2c0[0x33] = (RTCHitN)auVar127[0x33];
                                local_2c0[0x34] = (RTCHitN)auVar127[0x34];
                                local_2c0[0x35] = (RTCHitN)auVar127[0x35];
                                local_2c0[0x36] = (RTCHitN)auVar127[0x36];
                                local_2c0[0x37] = (RTCHitN)auVar127[0x37];
                                local_2c0[0x38] = (RTCHitN)auVar127[0x38];
                                local_2c0[0x39] = (RTCHitN)auVar127[0x39];
                                local_2c0[0x3a] = (RTCHitN)auVar127[0x3a];
                                local_2c0[0x3b] = (RTCHitN)auVar127[0x3b];
                                local_2c0[0x3c] = (RTCHitN)auVar127[0x3c];
                                local_2c0[0x3d] = (RTCHitN)auVar127[0x3d];
                                local_2c0[0x3e] = (RTCHitN)auVar127[0x3e];
                                local_2c0[0x3f] = (RTCHitN)auVar127[0x3f];
                                local_180 = local_340._0_8_;
                                uStack_178 = local_340._8_8_;
                                uStack_170 = local_340._16_8_;
                                uStack_168 = local_340._24_8_;
                                uStack_160 = local_340._32_8_;
                                uStack_158 = local_340._40_8_;
                                uStack_150 = local_340._48_8_;
                                uStack_148 = local_340._56_8_;
                                auVar127 = vmovdqa64_avx512f(local_300);
                                local_140 = vmovdqa64_avx512f(auVar127);
                                vpcmpeqd_avx2(auVar127._0_32_,auVar127._0_32_);
                                local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                                local_c0 = vbroadcastss_avx512f
                                                     (ZEXT416(context->user->instPrimID[0]));
                                *(float *)(ray + k * 4 + 0x200) = fVar148;
                                local_440 = local_380;
                                local_630.valid = (int *)local_440;
                                local_630.geometryUserPtr = pGVar7->userPtr;
                                local_630.context = context->user;
                                local_630.hit = local_2c0;
                                local_630.N = 0x10;
                                local_630.ray = (RTCRayN *)ray;
                                if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar7->intersectionFilterN)(&local_630);
                                  auVar268 = ZEXT1664(local_600);
                                  auVar73 = vxorps_avx512vl(auVar80,auVar80);
                                  auVar276 = ZEXT1664(auVar73);
                                  auVar273 = ZEXT464(0x3f800000);
                                  auVar102 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar272 = ZEXT3264(auVar102);
                                  auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar271 = ZEXT1664(auVar73);
                                  auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar270 = ZEXT1664(auVar73);
                                  auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar269 = ZEXT1664(auVar73);
                                  auVar73 = vxorps_avx512vl(auVar67,auVar67);
                                  auVar277 = ZEXT1664(auVar73);
                                }
                                auVar67 = auVar277._0_16_;
                                auVar73 = auVar276._0_16_;
                                auVar127 = vmovdqa64_avx512f(local_440);
                                uVar27 = vptestmd_avx512f(auVar127,auVar127);
                                if ((short)uVar27 == 0) {
LAB_01d6c48e:
                                  *(float *)(ray + k * 4 + 0x200) = fVar250;
                                }
                                else {
                                  p_Var8 = context->args->filter;
                                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var8)(&local_630);
                                    auVar268 = ZEXT1664(local_600);
                                    auVar73 = vxorps_avx512vl(auVar73,auVar73);
                                    auVar276 = ZEXT1664(auVar73);
                                    auVar273 = ZEXT464(0x3f800000);
                                    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar272 = ZEXT3264(auVar102);
                                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar271 = ZEXT1664(auVar73);
                                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar270 = ZEXT1664(auVar73);
                                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar269 = ZEXT1664(auVar73);
                                    auVar73 = vxorps_avx512vl(auVar67,auVar67);
                                    auVar277 = ZEXT1664(auVar73);
                                  }
                                  auVar127 = vmovdqa64_avx512f(local_440);
                                  uVar59 = vptestmd_avx512f(auVar127,auVar127);
                                  if ((short)uVar59 == 0) goto LAB_01d6c48e;
                                  iVar124 = *(int *)(local_630.hit + 4);
                                  iVar275 = *(int *)(local_630.hit + 8);
                                  iVar39 = *(int *)(local_630.hit + 0xc);
                                  iVar40 = *(int *)(local_630.hit + 0x10);
                                  iVar41 = *(int *)(local_630.hit + 0x14);
                                  iVar42 = *(int *)(local_630.hit + 0x18);
                                  iVar43 = *(int *)(local_630.hit + 0x1c);
                                  iVar44 = *(int *)(local_630.hit + 0x20);
                                  iVar45 = *(int *)(local_630.hit + 0x24);
                                  iVar46 = *(int *)(local_630.hit + 0x28);
                                  iVar47 = *(int *)(local_630.hit + 0x2c);
                                  iVar48 = *(int *)(local_630.hit + 0x30);
                                  iVar49 = *(int *)(local_630.hit + 0x34);
                                  iVar50 = *(int *)(local_630.hit + 0x38);
                                  iVar51 = *(int *)(local_630.hit + 0x3c);
                                  bVar52 = (byte)uVar59;
                                  bVar26 = (bool)((byte)(uVar59 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar59 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar59 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar59 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar59 >> 6) & 1);
                                  bVar17 = (bool)((byte)(uVar59 >> 7) & 1);
                                  bVar18 = (byte)(uVar59 >> 8);
                                  bVar19 = (bool)((byte)(uVar59 >> 9) & 1);
                                  bVar20 = (bool)((byte)(uVar59 >> 10) & 1);
                                  bVar21 = (bool)((byte)(uVar59 >> 0xb) & 1);
                                  bVar22 = (bool)((byte)(uVar59 >> 0xc) & 1);
                                  bVar23 = (bool)((byte)(uVar59 >> 0xd) & 1);
                                  bVar24 = (bool)((byte)(uVar59 >> 0xe) & 1);
                                  bVar25 = SUB81(uVar59 >> 0xf,0);
                                  *(uint *)(local_630.ray + 0x300) =
                                       (uint)(bVar52 & 1) * *(int *)local_630.hit |
                                       (uint)!(bool)(bVar52 & 1) * *(int *)(local_630.ray + 0x300);
                                  *(uint *)(local_630.ray + 0x304) =
                                       (uint)bVar26 * iVar124 |
                                       (uint)!bVar26 * *(int *)(local_630.ray + 0x304);
                                  *(uint *)(local_630.ray + 0x308) =
                                       (uint)bVar12 * iVar275 |
                                       (uint)!bVar12 * *(int *)(local_630.ray + 0x308);
                                  *(uint *)(local_630.ray + 0x30c) =
                                       (uint)bVar13 * iVar39 |
                                       (uint)!bVar13 * *(int *)(local_630.ray + 0x30c);
                                  *(uint *)(local_630.ray + 0x310) =
                                       (uint)bVar14 * iVar40 |
                                       (uint)!bVar14 * *(int *)(local_630.ray + 0x310);
                                  *(uint *)(local_630.ray + 0x314) =
                                       (uint)bVar15 * iVar41 |
                                       (uint)!bVar15 * *(int *)(local_630.ray + 0x314);
                                  *(uint *)(local_630.ray + 0x318) =
                                       (uint)bVar16 * iVar42 |
                                       (uint)!bVar16 * *(int *)(local_630.ray + 0x318);
                                  *(uint *)(local_630.ray + 0x31c) =
                                       (uint)bVar17 * iVar43 |
                                       (uint)!bVar17 * *(int *)(local_630.ray + 0x31c);
                                  *(uint *)(local_630.ray + 800) =
                                       (uint)(bVar18 & 1) * iVar44 |
                                       (uint)!(bool)(bVar18 & 1) * *(int *)(local_630.ray + 800);
                                  *(uint *)(local_630.ray + 0x324) =
                                       (uint)bVar19 * iVar45 |
                                       (uint)!bVar19 * *(int *)(local_630.ray + 0x324);
                                  *(uint *)(local_630.ray + 0x328) =
                                       (uint)bVar20 * iVar46 |
                                       (uint)!bVar20 * *(int *)(local_630.ray + 0x328);
                                  *(uint *)(local_630.ray + 0x32c) =
                                       (uint)bVar21 * iVar47 |
                                       (uint)!bVar21 * *(int *)(local_630.ray + 0x32c);
                                  *(uint *)(local_630.ray + 0x330) =
                                       (uint)bVar22 * iVar48 |
                                       (uint)!bVar22 * *(int *)(local_630.ray + 0x330);
                                  *(uint *)(local_630.ray + 0x334) =
                                       (uint)bVar23 * iVar49 |
                                       (uint)!bVar23 * *(int *)(local_630.ray + 0x334);
                                  *(uint *)(local_630.ray + 0x338) =
                                       (uint)bVar24 * iVar50 |
                                       (uint)!bVar24 * *(int *)(local_630.ray + 0x338);
                                  *(uint *)(local_630.ray + 0x33c) =
                                       (uint)bVar25 * iVar51 |
                                       (uint)!bVar25 * *(int *)(local_630.ray + 0x33c);
                                  iVar124 = *(int *)(local_630.hit + 0x44);
                                  iVar275 = *(int *)(local_630.hit + 0x48);
                                  iVar39 = *(int *)(local_630.hit + 0x4c);
                                  iVar40 = *(int *)(local_630.hit + 0x50);
                                  iVar41 = *(int *)(local_630.hit + 0x54);
                                  iVar42 = *(int *)(local_630.hit + 0x58);
                                  iVar43 = *(int *)(local_630.hit + 0x5c);
                                  iVar44 = *(int *)(local_630.hit + 0x60);
                                  iVar45 = *(int *)(local_630.hit + 100);
                                  iVar46 = *(int *)(local_630.hit + 0x68);
                                  iVar47 = *(int *)(local_630.hit + 0x6c);
                                  iVar48 = *(int *)(local_630.hit + 0x70);
                                  iVar49 = *(int *)(local_630.hit + 0x74);
                                  iVar50 = *(int *)(local_630.hit + 0x78);
                                  iVar51 = *(int *)(local_630.hit + 0x7c);
                                  bVar26 = (bool)((byte)(uVar59 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar59 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar59 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar59 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar59 >> 6) & 1);
                                  bVar17 = (bool)((byte)(uVar59 >> 7) & 1);
                                  bVar19 = (bool)((byte)(uVar59 >> 9) & 1);
                                  bVar20 = (bool)((byte)(uVar59 >> 10) & 1);
                                  bVar21 = (bool)((byte)(uVar59 >> 0xb) & 1);
                                  bVar22 = (bool)((byte)(uVar59 >> 0xc) & 1);
                                  bVar23 = (bool)((byte)(uVar59 >> 0xd) & 1);
                                  bVar24 = (bool)((byte)(uVar59 >> 0xe) & 1);
                                  bVar25 = SUB81(uVar59 >> 0xf,0);
                                  *(uint *)(local_630.ray + 0x340) =
                                       (uint)(bVar52 & 1) * *(int *)(local_630.hit + 0x40) |
                                       (uint)!(bool)(bVar52 & 1) * *(int *)(local_630.ray + 0x340);
                                  *(uint *)(local_630.ray + 0x344) =
                                       (uint)bVar26 * iVar124 |
                                       (uint)!bVar26 * *(int *)(local_630.ray + 0x344);
                                  *(uint *)(local_630.ray + 0x348) =
                                       (uint)bVar12 * iVar275 |
                                       (uint)!bVar12 * *(int *)(local_630.ray + 0x348);
                                  *(uint *)(local_630.ray + 0x34c) =
                                       (uint)bVar13 * iVar39 |
                                       (uint)!bVar13 * *(int *)(local_630.ray + 0x34c);
                                  *(uint *)(local_630.ray + 0x350) =
                                       (uint)bVar14 * iVar40 |
                                       (uint)!bVar14 * *(int *)(local_630.ray + 0x350);
                                  *(uint *)(local_630.ray + 0x354) =
                                       (uint)bVar15 * iVar41 |
                                       (uint)!bVar15 * *(int *)(local_630.ray + 0x354);
                                  *(uint *)(local_630.ray + 0x358) =
                                       (uint)bVar16 * iVar42 |
                                       (uint)!bVar16 * *(int *)(local_630.ray + 0x358);
                                  *(uint *)(local_630.ray + 0x35c) =
                                       (uint)bVar17 * iVar43 |
                                       (uint)!bVar17 * *(int *)(local_630.ray + 0x35c);
                                  *(uint *)(local_630.ray + 0x360) =
                                       (uint)(bVar18 & 1) * iVar44 |
                                       (uint)!(bool)(bVar18 & 1) * *(int *)(local_630.ray + 0x360);
                                  *(uint *)(local_630.ray + 0x364) =
                                       (uint)bVar19 * iVar45 |
                                       (uint)!bVar19 * *(int *)(local_630.ray + 0x364);
                                  *(uint *)(local_630.ray + 0x368) =
                                       (uint)bVar20 * iVar46 |
                                       (uint)!bVar20 * *(int *)(local_630.ray + 0x368);
                                  *(uint *)(local_630.ray + 0x36c) =
                                       (uint)bVar21 * iVar47 |
                                       (uint)!bVar21 * *(int *)(local_630.ray + 0x36c);
                                  *(uint *)(local_630.ray + 0x370) =
                                       (uint)bVar22 * iVar48 |
                                       (uint)!bVar22 * *(int *)(local_630.ray + 0x370);
                                  *(uint *)(local_630.ray + 0x374) =
                                       (uint)bVar23 * iVar49 |
                                       (uint)!bVar23 * *(int *)(local_630.ray + 0x374);
                                  *(uint *)(local_630.ray + 0x378) =
                                       (uint)bVar24 * iVar50 |
                                       (uint)!bVar24 * *(int *)(local_630.ray + 0x378);
                                  *(uint *)(local_630.ray + 0x37c) =
                                       (uint)bVar25 * iVar51 |
                                       (uint)!bVar25 * *(int *)(local_630.ray + 0x37c);
                                  iVar124 = *(int *)(local_630.hit + 0x84);
                                  iVar275 = *(int *)(local_630.hit + 0x88);
                                  iVar39 = *(int *)(local_630.hit + 0x8c);
                                  iVar40 = *(int *)(local_630.hit + 0x90);
                                  iVar41 = *(int *)(local_630.hit + 0x94);
                                  iVar42 = *(int *)(local_630.hit + 0x98);
                                  iVar43 = *(int *)(local_630.hit + 0x9c);
                                  iVar44 = *(int *)(local_630.hit + 0xa0);
                                  iVar45 = *(int *)(local_630.hit + 0xa4);
                                  iVar46 = *(int *)(local_630.hit + 0xa8);
                                  iVar47 = *(int *)(local_630.hit + 0xac);
                                  iVar48 = *(int *)(local_630.hit + 0xb0);
                                  iVar49 = *(int *)(local_630.hit + 0xb4);
                                  iVar50 = *(int *)(local_630.hit + 0xb8);
                                  iVar51 = *(int *)(local_630.hit + 0xbc);
                                  bVar26 = (bool)((byte)(uVar59 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar59 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar59 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar59 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar59 >> 6) & 1);
                                  bVar17 = (bool)((byte)(uVar59 >> 7) & 1);
                                  bVar19 = (bool)((byte)(uVar59 >> 9) & 1);
                                  bVar20 = (bool)((byte)(uVar59 >> 10) & 1);
                                  bVar21 = (bool)((byte)(uVar59 >> 0xb) & 1);
                                  bVar22 = (bool)((byte)(uVar59 >> 0xc) & 1);
                                  bVar23 = (bool)((byte)(uVar59 >> 0xd) & 1);
                                  bVar24 = (bool)((byte)(uVar59 >> 0xe) & 1);
                                  bVar25 = SUB81(uVar59 >> 0xf,0);
                                  *(uint *)(local_630.ray + 0x380) =
                                       (uint)(bVar52 & 1) * *(int *)(local_630.hit + 0x80) |
                                       (uint)!(bool)(bVar52 & 1) * *(int *)(local_630.ray + 0x380);
                                  *(uint *)(local_630.ray + 900) =
                                       (uint)bVar26 * iVar124 |
                                       (uint)!bVar26 * *(int *)(local_630.ray + 900);
                                  *(uint *)(local_630.ray + 0x388) =
                                       (uint)bVar12 * iVar275 |
                                       (uint)!bVar12 * *(int *)(local_630.ray + 0x388);
                                  *(uint *)(local_630.ray + 0x38c) =
                                       (uint)bVar13 * iVar39 |
                                       (uint)!bVar13 * *(int *)(local_630.ray + 0x38c);
                                  *(uint *)(local_630.ray + 0x390) =
                                       (uint)bVar14 * iVar40 |
                                       (uint)!bVar14 * *(int *)(local_630.ray + 0x390);
                                  *(uint *)(local_630.ray + 0x394) =
                                       (uint)bVar15 * iVar41 |
                                       (uint)!bVar15 * *(int *)(local_630.ray + 0x394);
                                  *(uint *)(local_630.ray + 0x398) =
                                       (uint)bVar16 * iVar42 |
                                       (uint)!bVar16 * *(int *)(local_630.ray + 0x398);
                                  *(uint *)(local_630.ray + 0x39c) =
                                       (uint)bVar17 * iVar43 |
                                       (uint)!bVar17 * *(int *)(local_630.ray + 0x39c);
                                  *(uint *)(local_630.ray + 0x3a0) =
                                       (uint)(bVar18 & 1) * iVar44 |
                                       (uint)!(bool)(bVar18 & 1) * *(int *)(local_630.ray + 0x3a0);
                                  *(uint *)(local_630.ray + 0x3a4) =
                                       (uint)bVar19 * iVar45 |
                                       (uint)!bVar19 * *(int *)(local_630.ray + 0x3a4);
                                  *(uint *)(local_630.ray + 0x3a8) =
                                       (uint)bVar20 * iVar46 |
                                       (uint)!bVar20 * *(int *)(local_630.ray + 0x3a8);
                                  *(uint *)(local_630.ray + 0x3ac) =
                                       (uint)bVar21 * iVar47 |
                                       (uint)!bVar21 * *(int *)(local_630.ray + 0x3ac);
                                  *(uint *)(local_630.ray + 0x3b0) =
                                       (uint)bVar22 * iVar48 |
                                       (uint)!bVar22 * *(int *)(local_630.ray + 0x3b0);
                                  *(uint *)(local_630.ray + 0x3b4) =
                                       (uint)bVar23 * iVar49 |
                                       (uint)!bVar23 * *(int *)(local_630.ray + 0x3b4);
                                  *(uint *)(local_630.ray + 0x3b8) =
                                       (uint)bVar24 * iVar50 |
                                       (uint)!bVar24 * *(int *)(local_630.ray + 0x3b8);
                                  *(uint *)(local_630.ray + 0x3bc) =
                                       (uint)bVar25 * iVar51 |
                                       (uint)!bVar25 * *(int *)(local_630.ray + 0x3bc);
                                  iVar124 = *(int *)(local_630.hit + 0xc4);
                                  iVar275 = *(int *)(local_630.hit + 200);
                                  iVar39 = *(int *)(local_630.hit + 0xcc);
                                  iVar40 = *(int *)(local_630.hit + 0xd0);
                                  iVar41 = *(int *)(local_630.hit + 0xd4);
                                  iVar42 = *(int *)(local_630.hit + 0xd8);
                                  iVar43 = *(int *)(local_630.hit + 0xdc);
                                  iVar44 = *(int *)(local_630.hit + 0xe0);
                                  iVar45 = *(int *)(local_630.hit + 0xe4);
                                  iVar46 = *(int *)(local_630.hit + 0xe8);
                                  iVar47 = *(int *)(local_630.hit + 0xec);
                                  iVar48 = *(int *)(local_630.hit + 0xf0);
                                  iVar49 = *(int *)(local_630.hit + 0xf4);
                                  iVar50 = *(int *)(local_630.hit + 0xf8);
                                  iVar51 = *(int *)(local_630.hit + 0xfc);
                                  bVar26 = (bool)((byte)(uVar59 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar59 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar59 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar59 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar59 >> 6) & 1);
                                  bVar17 = (bool)((byte)(uVar59 >> 7) & 1);
                                  bVar19 = (bool)((byte)(uVar59 >> 9) & 1);
                                  bVar20 = (bool)((byte)(uVar59 >> 10) & 1);
                                  bVar21 = (bool)((byte)(uVar59 >> 0xb) & 1);
                                  bVar22 = (bool)((byte)(uVar59 >> 0xc) & 1);
                                  bVar23 = (bool)((byte)(uVar59 >> 0xd) & 1);
                                  bVar24 = (bool)((byte)(uVar59 >> 0xe) & 1);
                                  bVar25 = SUB81(uVar59 >> 0xf,0);
                                  *(uint *)(local_630.ray + 0x3c0) =
                                       (uint)(bVar52 & 1) * *(int *)(local_630.hit + 0xc0) |
                                       (uint)!(bool)(bVar52 & 1) * *(int *)(local_630.ray + 0x3c0);
                                  *(uint *)(local_630.ray + 0x3c4) =
                                       (uint)bVar26 * iVar124 |
                                       (uint)!bVar26 * *(int *)(local_630.ray + 0x3c4);
                                  *(uint *)(local_630.ray + 0x3c8) =
                                       (uint)bVar12 * iVar275 |
                                       (uint)!bVar12 * *(int *)(local_630.ray + 0x3c8);
                                  *(uint *)(local_630.ray + 0x3cc) =
                                       (uint)bVar13 * iVar39 |
                                       (uint)!bVar13 * *(int *)(local_630.ray + 0x3cc);
                                  *(uint *)(local_630.ray + 0x3d0) =
                                       (uint)bVar14 * iVar40 |
                                       (uint)!bVar14 * *(int *)(local_630.ray + 0x3d0);
                                  *(uint *)(local_630.ray + 0x3d4) =
                                       (uint)bVar15 * iVar41 |
                                       (uint)!bVar15 * *(int *)(local_630.ray + 0x3d4);
                                  *(uint *)(local_630.ray + 0x3d8) =
                                       (uint)bVar16 * iVar42 |
                                       (uint)!bVar16 * *(int *)(local_630.ray + 0x3d8);
                                  *(uint *)(local_630.ray + 0x3dc) =
                                       (uint)bVar17 * iVar43 |
                                       (uint)!bVar17 * *(int *)(local_630.ray + 0x3dc);
                                  *(uint *)(local_630.ray + 0x3e0) =
                                       (uint)(bVar18 & 1) * iVar44 |
                                       (uint)!(bool)(bVar18 & 1) * *(int *)(local_630.ray + 0x3e0);
                                  *(uint *)(local_630.ray + 0x3e4) =
                                       (uint)bVar19 * iVar45 |
                                       (uint)!bVar19 * *(int *)(local_630.ray + 0x3e4);
                                  *(uint *)(local_630.ray + 1000) =
                                       (uint)bVar20 * iVar46 |
                                       (uint)!bVar20 * *(int *)(local_630.ray + 1000);
                                  *(uint *)(local_630.ray + 0x3ec) =
                                       (uint)bVar21 * iVar47 |
                                       (uint)!bVar21 * *(int *)(local_630.ray + 0x3ec);
                                  *(uint *)(local_630.ray + 0x3f0) =
                                       (uint)bVar22 * iVar48 |
                                       (uint)!bVar22 * *(int *)(local_630.ray + 0x3f0);
                                  *(uint *)(local_630.ray + 0x3f4) =
                                       (uint)bVar23 * iVar49 |
                                       (uint)!bVar23 * *(int *)(local_630.ray + 0x3f4);
                                  *(uint *)(local_630.ray + 0x3f8) =
                                       (uint)bVar24 * iVar50 |
                                       (uint)!bVar24 * *(int *)(local_630.ray + 0x3f8);
                                  *(uint *)(local_630.ray + 0x3fc) =
                                       (uint)bVar25 * iVar51 |
                                       (uint)!bVar25 * *(int *)(local_630.ray + 0x3fc);
                                  iVar124 = *(int *)(local_630.hit + 0x104);
                                  iVar275 = *(int *)(local_630.hit + 0x108);
                                  iVar39 = *(int *)(local_630.hit + 0x10c);
                                  iVar40 = *(int *)(local_630.hit + 0x110);
                                  iVar41 = *(int *)(local_630.hit + 0x114);
                                  iVar42 = *(int *)(local_630.hit + 0x118);
                                  iVar43 = *(int *)(local_630.hit + 0x11c);
                                  iVar44 = *(int *)(local_630.hit + 0x120);
                                  iVar45 = *(int *)(local_630.hit + 0x124);
                                  iVar46 = *(int *)(local_630.hit + 0x128);
                                  iVar47 = *(int *)(local_630.hit + 300);
                                  iVar48 = *(int *)(local_630.hit + 0x130);
                                  iVar49 = *(int *)(local_630.hit + 0x134);
                                  iVar50 = *(int *)(local_630.hit + 0x138);
                                  iVar51 = *(int *)(local_630.hit + 0x13c);
                                  bVar26 = (bool)((byte)(uVar59 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar59 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar59 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar59 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar59 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar59 >> 6) & 1);
                                  bVar17 = (bool)((byte)(uVar59 >> 7) & 1);
                                  bVar19 = (bool)((byte)(uVar59 >> 9) & 1);
                                  bVar20 = (bool)((byte)(uVar59 >> 10) & 1);
                                  bVar21 = (bool)((byte)(uVar59 >> 0xb) & 1);
                                  bVar22 = (bool)((byte)(uVar59 >> 0xc) & 1);
                                  bVar23 = (bool)((byte)(uVar59 >> 0xd) & 1);
                                  bVar24 = (bool)((byte)(uVar59 >> 0xe) & 1);
                                  bVar25 = SUB81(uVar59 >> 0xf,0);
                                  *(uint *)(local_630.ray + 0x400) =
                                       (uint)(bVar52 & 1) * *(int *)(local_630.hit + 0x100) |
                                       (uint)!(bool)(bVar52 & 1) * *(int *)(local_630.ray + 0x400);
                                  *(uint *)(local_630.ray + 0x404) =
                                       (uint)bVar26 * iVar124 |
                                       (uint)!bVar26 * *(int *)(local_630.ray + 0x404);
                                  *(uint *)(local_630.ray + 0x408) =
                                       (uint)bVar12 * iVar275 |
                                       (uint)!bVar12 * *(int *)(local_630.ray + 0x408);
                                  *(uint *)(local_630.ray + 0x40c) =
                                       (uint)bVar13 * iVar39 |
                                       (uint)!bVar13 * *(int *)(local_630.ray + 0x40c);
                                  *(uint *)(local_630.ray + 0x410) =
                                       (uint)bVar14 * iVar40 |
                                       (uint)!bVar14 * *(int *)(local_630.ray + 0x410);
                                  *(uint *)(local_630.ray + 0x414) =
                                       (uint)bVar15 * iVar41 |
                                       (uint)!bVar15 * *(int *)(local_630.ray + 0x414);
                                  *(uint *)(local_630.ray + 0x418) =
                                       (uint)bVar16 * iVar42 |
                                       (uint)!bVar16 * *(int *)(local_630.ray + 0x418);
                                  *(uint *)(local_630.ray + 0x41c) =
                                       (uint)bVar17 * iVar43 |
                                       (uint)!bVar17 * *(int *)(local_630.ray + 0x41c);
                                  *(uint *)(local_630.ray + 0x420) =
                                       (uint)(bVar18 & 1) * iVar44 |
                                       (uint)!(bool)(bVar18 & 1) * *(int *)(local_630.ray + 0x420);
                                  *(uint *)(local_630.ray + 0x424) =
                                       (uint)bVar19 * iVar45 |
                                       (uint)!bVar19 * *(int *)(local_630.ray + 0x424);
                                  *(uint *)(local_630.ray + 0x428) =
                                       (uint)bVar20 * iVar46 |
                                       (uint)!bVar20 * *(int *)(local_630.ray + 0x428);
                                  *(uint *)(local_630.ray + 0x42c) =
                                       (uint)bVar21 * iVar47 |
                                       (uint)!bVar21 * *(int *)(local_630.ray + 0x42c);
                                  *(uint *)(local_630.ray + 0x430) =
                                       (uint)bVar22 * iVar48 |
                                       (uint)!bVar22 * *(int *)(local_630.ray + 0x430);
                                  *(uint *)(local_630.ray + 0x434) =
                                       (uint)bVar23 * iVar49 |
                                       (uint)!bVar23 * *(int *)(local_630.ray + 0x434);
                                  *(uint *)(local_630.ray + 0x438) =
                                       (uint)bVar24 * iVar50 |
                                       (uint)!bVar24 * *(int *)(local_630.ray + 0x438);
                                  *(uint *)(local_630.ray + 0x43c) =
                                       (uint)bVar25 * iVar51 |
                                       (uint)!bVar25 * *(int *)(local_630.ray + 0x43c);
                                  auVar127 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_630.hit + 0x140));
                                  auVar127 = vmovdqu32_avx512f(auVar127);
                                  *(undefined1 (*) [64])(local_630.ray + 0x440) = auVar127;
                                  auVar127 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_630.hit + 0x180));
                                  auVar127 = vmovdqu32_avx512f(auVar127);
                                  *(undefined1 (*) [64])(local_630.ray + 0x480) = auVar127;
                                  auVar274 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_630.hit + 0x1c0));
                                  auVar127 = vmovdqa32_avx512f(auVar274);
                                  *(undefined1 (*) [64])(local_630.ray + 0x4c0) = auVar127;
                                  auVar122 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_630.hit + 0x200));
                                  bVar26 = (bool)((byte)(uVar59 >> 1) & 1);
                                  auVar38._4_56_ = auVar122._8_56_;
                                  auVar38._0_4_ =
                                       (uint)bVar26 * auVar122._4_4_ |
                                       (uint)!bVar26 * auVar274._4_4_;
                                  auVar123._0_8_ = auVar38._0_8_ << 0x20;
                                  bVar26 = (bool)((byte)(uVar59 >> 2) & 1);
                                  auVar123._8_4_ =
                                       (uint)bVar26 * auVar122._8_4_ |
                                       (uint)!bVar26 * auVar274._8_4_;
                                  bVar26 = (bool)((byte)(uVar59 >> 3) & 1);
                                  auVar123._12_4_ =
                                       (uint)bVar26 * auVar122._12_4_ |
                                       (uint)!bVar26 * auVar274._12_4_;
                                  bVar26 = (bool)((byte)(uVar59 >> 4) & 1);
                                  auVar123._16_4_ =
                                       (uint)bVar26 * auVar122._16_4_ |
                                       (uint)!bVar26 * auVar274._16_4_;
                                  bVar26 = (bool)((byte)(uVar59 >> 5) & 1);
                                  auVar123._20_4_ =
                                       (uint)bVar26 * auVar122._20_4_ |
                                       (uint)!bVar26 * auVar274._20_4_;
                                  bVar26 = (bool)((byte)(uVar59 >> 6) & 1);
                                  auVar123._24_4_ =
                                       (uint)bVar26 * auVar122._24_4_ |
                                       (uint)!bVar26 * auVar274._24_4_;
                                  bVar26 = (bool)((byte)(uVar59 >> 7) & 1);
                                  auVar123._28_4_ =
                                       (uint)bVar26 * auVar122._28_4_ |
                                       (uint)!bVar26 * auVar274._28_4_;
                                  auVar123._32_4_ =
                                       (uint)(bVar18 & 1) * auVar122._32_4_ |
                                       (uint)!(bool)(bVar18 & 1) * auVar274._32_4_;
                                  bVar26 = (bool)((byte)(uVar59 >> 9) & 1);
                                  auVar123._36_4_ =
                                       (uint)bVar26 * auVar122._36_4_ |
                                       (uint)!bVar26 * auVar274._36_4_;
                                  bVar26 = (bool)((byte)(uVar59 >> 10) & 1);
                                  auVar123._40_4_ =
                                       (uint)bVar26 * auVar122._40_4_ |
                                       (uint)!bVar26 * auVar274._40_4_;
                                  bVar26 = (bool)((byte)(uVar59 >> 0xb) & 1);
                                  auVar123._44_4_ =
                                       (uint)bVar26 * auVar122._44_4_ |
                                       (uint)!bVar26 * auVar274._44_4_;
                                  bVar26 = (bool)((byte)(uVar59 >> 0xc) & 1);
                                  auVar123._48_4_ =
                                       (uint)bVar26 * auVar122._48_4_ |
                                       (uint)!bVar26 * auVar274._48_4_;
                                  bVar26 = (bool)((byte)(uVar59 >> 0xd) & 1);
                                  auVar123._52_4_ =
                                       (uint)bVar26 * auVar122._52_4_ |
                                       (uint)!bVar26 * auVar274._52_4_;
                                  bVar26 = (bool)((byte)(uVar59 >> 0xe) & 1);
                                  auVar123._56_4_ =
                                       (uint)bVar26 * auVar122._56_4_ |
                                       (uint)!bVar26 * auVar274._56_4_;
                                  bVar26 = SUB81(uVar59 >> 0xf,0);
                                  auVar123._60_4_ =
                                       (uint)bVar26 * auVar122._60_4_ |
                                       (uint)!bVar26 * auVar274._60_4_;
                                  auVar127._16_48_ = auVar123._16_48_;
                                  auVar274 = vmovdqa32_avx512f(auVar122);
                                  *(undefined1 (*) [64])(local_630.ray + 0x500) = auVar274;
                                }
                                auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar274 = ZEXT1664(auVar73);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar58 = lVar58 + -1;
              } while (lVar58 != 0);
            }
          }
          else {
            auVar73 = vxorps_avx512vl(ZEXT416(5),auVar80);
            auVar276 = ZEXT1664(auVar73);
          }
        }
      }
      auVar122._32_32_ = auVar127._32_32_;
    } while (bVar11);
    auVar73 = vinsertps_avx512f(auVar75,auVar64,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }